

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  RTCRayQueryContext *pRVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  byte bVar73;
  ulong uVar74;
  uint uVar75;
  byte bVar76;
  byte bVar77;
  uint uVar78;
  int iVar79;
  long lVar80;
  byte bVar81;
  long lVar82;
  undefined1 uVar83;
  undefined1 uVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar151;
  uint uVar152;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar154;
  uint uVar155;
  uint uVar156;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  uint uVar153;
  uint uVar157;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar158;
  float fVar159;
  vint4 bi_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar175;
  float fVar176;
  undefined4 uVar177;
  float fVar196;
  float fVar198;
  vint4 bi_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar192 [32];
  undefined1 auVar181 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vint4 bi;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  vint4 ai_2;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  vint4 ai_1;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  vint4 ai;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [28];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a50) [32];
  ulong local_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar6 = prim[1];
  uVar74 = (ulong)(byte)PVar6;
  lVar82 = uVar74 * 0x25;
  fVar158 = *(float *)(prim + lVar82 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + lVar82 + 6));
  auVar231._0_4_ = fVar158 * auVar92._0_4_;
  auVar231._4_4_ = fVar158 * auVar92._4_4_;
  auVar231._8_4_ = fVar158 * auVar92._8_4_;
  auVar231._12_4_ = fVar158 * auVar92._12_4_;
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar160._0_4_ = fVar158 * auVar91._0_4_;
  auVar160._4_4_ = fVar158 * auVar91._4_4_;
  auVar160._8_4_ = fVar158 * auVar91._8_4_;
  auVar160._12_4_ = fVar158 * auVar91._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xf + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar74 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1a + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1b + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1c + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar256._4_4_ = auVar160._0_4_;
  auVar256._0_4_ = auVar160._0_4_;
  auVar256._8_4_ = auVar160._0_4_;
  auVar256._12_4_ = auVar160._0_4_;
  auVar99 = vshufps_avx(auVar160,auVar160,0x55);
  auVar102 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar158 = auVar102._0_4_;
  auVar208._0_4_ = fVar158 * auVar94._0_4_;
  fVar175 = auVar102._4_4_;
  auVar208._4_4_ = fVar175 * auVar94._4_4_;
  fVar196 = auVar102._8_4_;
  auVar208._8_4_ = fVar196 * auVar94._8_4_;
  fVar198 = auVar102._12_4_;
  auVar208._12_4_ = fVar198 * auVar94._12_4_;
  auVar178._0_4_ = auVar101._0_4_ * fVar158;
  auVar178._4_4_ = auVar101._4_4_ * fVar175;
  auVar178._8_4_ = auVar101._8_4_ * fVar196;
  auVar178._12_4_ = auVar101._12_4_ * fVar198;
  auVar161._0_4_ = auVar98._0_4_ * fVar158;
  auVar161._4_4_ = auVar98._4_4_ * fVar175;
  auVar161._8_4_ = auVar98._8_4_ * fVar196;
  auVar161._12_4_ = auVar98._12_4_ * fVar198;
  auVar102 = vfmadd231ps_fma(auVar208,auVar99,auVar91);
  auVar103 = vfmadd231ps_fma(auVar178,auVar99,auVar96);
  auVar99 = vfmadd231ps_fma(auVar161,auVar93,auVar99);
  auVar100 = vfmadd231ps_fma(auVar102,auVar256,auVar92);
  auVar103 = vfmadd231ps_fma(auVar103,auVar256,auVar95);
  auVar104 = vfmadd231ps_fma(auVar99,auVar97,auVar256);
  auVar283._4_4_ = auVar231._0_4_;
  auVar283._0_4_ = auVar231._0_4_;
  auVar283._8_4_ = auVar231._0_4_;
  auVar283._12_4_ = auVar231._0_4_;
  auVar99 = vshufps_avx(auVar231,auVar231,0x55);
  auVar102 = vshufps_avx(auVar231,auVar231,0xaa);
  fVar158 = auVar102._0_4_;
  auVar257._0_4_ = fVar158 * auVar94._0_4_;
  fVar175 = auVar102._4_4_;
  auVar257._4_4_ = fVar175 * auVar94._4_4_;
  fVar196 = auVar102._8_4_;
  auVar257._8_4_ = fVar196 * auVar94._8_4_;
  fVar198 = auVar102._12_4_;
  auVar257._12_4_ = fVar198 * auVar94._12_4_;
  auVar247._0_4_ = auVar101._0_4_ * fVar158;
  auVar247._4_4_ = auVar101._4_4_ * fVar175;
  auVar247._8_4_ = auVar101._8_4_ * fVar196;
  auVar247._12_4_ = auVar101._12_4_ * fVar198;
  auVar232._0_4_ = auVar98._0_4_ * fVar158;
  auVar232._4_4_ = auVar98._4_4_ * fVar175;
  auVar232._8_4_ = auVar98._8_4_ * fVar196;
  auVar232._12_4_ = auVar98._12_4_ * fVar198;
  auVar91 = vfmadd231ps_fma(auVar257,auVar99,auVar91);
  auVar94 = vfmadd231ps_fma(auVar247,auVar99,auVar96);
  auVar96 = vfmadd231ps_fma(auVar232,auVar99,auVar93);
  auVar33 = vfmadd231ps_fma(auVar91,auVar283,auVar92);
  auVar160 = vfmadd231ps_fma(auVar94,auVar283,auVar95);
  auVar278._8_4_ = 0x7fffffff;
  auVar278._0_8_ = 0x7fffffff7fffffff;
  auVar278._12_4_ = 0x7fffffff;
  auVar161 = vfmadd231ps_fma(auVar96,auVar283,auVar97);
  auVar92 = vandps_avx(auVar278,auVar100);
  auVar273._8_4_ = 0x219392ef;
  auVar273._0_8_ = 0x219392ef219392ef;
  auVar273._12_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar92,auVar273,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar88._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar100._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar100._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar100._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar100._12_4_;
  auVar92 = vandps_avx(auVar278,auVar103);
  uVar85 = vcmpps_avx512vl(auVar92,auVar273,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar89._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._12_4_;
  auVar92 = vandps_avx(auVar278,auVar104);
  uVar85 = vcmpps_avx512vl(auVar92,auVar273,1);
  bVar13 = (bool)((byte)uVar85 & 1);
  auVar90._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._0_4_;
  bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._4_4_;
  bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._8_4_;
  bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._12_4_;
  auVar91 = vrcp14ps_avx512vl(auVar88);
  auVar274._8_4_ = 0x3f800000;
  auVar274._0_8_ = 0x3f8000003f800000;
  auVar274._12_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar88,auVar91,auVar274);
  auVar100 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vfnmadd213ps_fma(auVar89,auVar91,auVar274);
  auVar104 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar90);
  auVar92 = vfnmadd213ps_fma(auVar90,auVar91,auVar274);
  auVar105 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
  fVar158 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar82 + 0x16)) *
            *(float *)(prim + lVar82 + 0x1a);
  auVar265._4_4_ = fVar158;
  auVar265._0_4_ = fVar158;
  auVar265._8_4_ = fVar158;
  auVar265._12_4_ = fVar158;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar91 = vpmovsxwd_avx(auVar91);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar95 = vsubps_avx(auVar91,auVar92);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar91 = vpmovsxwd_avx(auVar94);
  auVar94 = vfmadd213ps_fma(auVar95,auVar265,auVar92);
  auVar92 = vcvtdq2ps_avx(auVar91);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar74 * 0xd + 6);
  auVar91 = vpmovsxwd_avx(auVar95);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar95 = vfmadd213ps_fma(auVar91,auVar265,auVar92);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar74 * 0x12 + 6);
  auVar92 = vpmovsxwd_avx(auVar96);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar85 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar74 * 2 + uVar85 + 6);
  auVar91 = vpmovsxwd_avx(auVar101);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar96 = vfmadd213ps_fma(auVar91,auVar265,auVar92);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar92 = vpmovsxwd_avx(auVar97);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar74 * 0x18 + 6);
  auVar91 = vpmovsxwd_avx(auVar93);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar101 = vfmadd213ps_fma(auVar91,auVar265,auVar92);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar74 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar98);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar74 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar91 = vpmovsxwd_avx(auVar99);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar97 = vfmadd213ps_fma(auVar91,auVar265,auVar92);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar74) + 6);
  auVar92 = vpmovsxwd_avx(auVar102);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar74 * 0x23 + 6);
  auVar91 = vpmovsxwd_avx(auVar103);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar91 = vfmadd213ps_fma(auVar91,auVar265,auVar92);
  auVar92 = vsubps_avx(auVar94,auVar33);
  auVar266._0_4_ = auVar100._0_4_ * auVar92._0_4_;
  auVar266._4_4_ = auVar100._4_4_ * auVar92._4_4_;
  auVar266._8_4_ = auVar100._8_4_ * auVar92._8_4_;
  auVar266._12_4_ = auVar100._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar95,auVar33);
  auVar209._0_4_ = auVar100._0_4_ * auVar92._0_4_;
  auVar209._4_4_ = auVar100._4_4_ * auVar92._4_4_;
  auVar209._8_4_ = auVar100._8_4_ * auVar92._8_4_;
  auVar209._12_4_ = auVar100._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar96,auVar160);
  auVar258._0_4_ = auVar104._0_4_ * auVar92._0_4_;
  auVar258._4_4_ = auVar104._4_4_ * auVar92._4_4_;
  auVar258._8_4_ = auVar104._8_4_ * auVar92._8_4_;
  auVar258._12_4_ = auVar104._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar101,auVar160);
  auVar179._0_4_ = auVar104._0_4_ * auVar92._0_4_;
  auVar179._4_4_ = auVar104._4_4_ * auVar92._4_4_;
  auVar179._8_4_ = auVar104._8_4_ * auVar92._8_4_;
  auVar179._12_4_ = auVar104._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar97,auVar161);
  auVar248._0_4_ = auVar105._0_4_ * auVar92._0_4_;
  auVar248._4_4_ = auVar105._4_4_ * auVar92._4_4_;
  auVar248._8_4_ = auVar105._8_4_ * auVar92._8_4_;
  auVar248._12_4_ = auVar105._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar91,auVar161);
  auVar162._0_4_ = auVar105._0_4_ * auVar92._0_4_;
  auVar162._4_4_ = auVar105._4_4_ * auVar92._4_4_;
  auVar162._8_4_ = auVar105._8_4_ * auVar92._8_4_;
  auVar162._12_4_ = auVar105._12_4_ * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar266,auVar209);
  auVar91 = vpminsd_avx(auVar258,auVar179);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91 = vpminsd_avx(auVar248,auVar162);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar100._4_4_ = uVar177;
  auVar100._0_4_ = uVar177;
  auVar100._8_4_ = uVar177;
  auVar100._12_4_ = uVar177;
  auVar91 = vmaxps_avx512vl(auVar91,auVar100);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar104._8_4_ = 0x3f7ffffa;
  auVar104._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar104._12_4_ = 0x3f7ffffa;
  local_660 = vmulps_avx512vl(auVar92,auVar104);
  auVar92 = vpmaxsd_avx(auVar266,auVar209);
  auVar91 = vpmaxsd_avx(auVar258,auVar179);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar91 = vpmaxsd_avx(auVar248,auVar162);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar105._4_4_ = uVar177;
  auVar105._0_4_ = uVar177;
  auVar105._8_4_ = uVar177;
  auVar105._12_4_ = uVar177;
  auVar91 = vminps_avx512vl(auVar91,auVar105);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar33._8_4_ = 0x3f800003;
  auVar33._0_8_ = 0x3f8000033f800003;
  auVar33._12_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar33);
  auVar91 = vpbroadcastd_avx512vl();
  uVar30 = vcmpps_avx512vl(local_660,auVar92,2);
  local_928 = vpcmpgtd_avx512vl(auVar91,_DAT_01f7fcf0);
  local_928 = ((byte)uVar30 & 0xf) & local_928;
  if ((char)local_928 == '\0') {
    return;
  }
  local_a50 = (undefined1 (*) [32])local_240;
  auVar174 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar174);
  local_930 = prim;
LAB_01b71b10:
  lVar82 = 0;
  for (uVar85 = local_928; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  uVar75 = *(uint *)(local_930 + 2);
  local_a48 = (ulong)*(uint *)(local_930 + lVar82 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar75].ptr;
  uVar85 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_a48 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar158 = (pGVar7->time_range).lower;
  fVar158 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar158) / ((pGVar7->time_range).upper - fVar158));
  auVar92 = vroundss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),9);
  auVar92 = vminss_avx(auVar92,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar92 = vmaxss_avx(ZEXT816(0) << 0x20,auVar92);
  fVar158 = fVar158 - auVar92._0_4_;
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar80 = (long)(int)auVar92._0_4_ * 0x38;
  lVar82 = *(long *)(_Var8 + 0x10 + lVar80);
  lVar9 = *(long *)(_Var8 + 0x38 + lVar80);
  lVar10 = *(long *)(_Var8 + 0x48 + lVar80);
  pfVar5 = (float *)(lVar9 + uVar85 * lVar10);
  auVar210._0_4_ = fVar158 * *pfVar5;
  auVar210._4_4_ = fVar158 * pfVar5[1];
  auVar210._8_4_ = fVar158 * pfVar5[2];
  auVar210._12_4_ = fVar158 * pfVar5[3];
  pfVar5 = (float *)(lVar9 + (uVar85 + 1) * lVar10);
  auVar233._0_4_ = fVar158 * *pfVar5;
  auVar233._4_4_ = fVar158 * pfVar5[1];
  auVar233._8_4_ = fVar158 * pfVar5[2];
  auVar233._12_4_ = fVar158 * pfVar5[3];
  pfVar5 = (float *)(lVar9 + (uVar85 + 2) * lVar10);
  auVar249._0_4_ = fVar158 * *pfVar5;
  auVar249._4_4_ = fVar158 * pfVar5[1];
  auVar249._8_4_ = fVar158 * pfVar5[2];
  auVar249._12_4_ = fVar158 * pfVar5[3];
  pfVar5 = (float *)(lVar9 + lVar10 * (uVar85 + 3));
  auVar180._0_4_ = fVar158 * *pfVar5;
  auVar180._4_4_ = fVar158 * pfVar5[1];
  auVar180._8_4_ = fVar158 * pfVar5[2];
  auVar180._12_4_ = fVar158 * pfVar5[3];
  lVar9 = *(long *)(_Var8 + lVar80);
  fVar158 = 1.0 - fVar158;
  auVar163._4_4_ = fVar158;
  auVar163._0_4_ = fVar158;
  auVar163._8_4_ = fVar158;
  auVar163._12_4_ = fVar158;
  auVar94 = vfmadd231ps_fma(auVar210,auVar163,*(undefined1 (*) [16])(lVar9 + lVar82 * uVar85));
  auVar95 = vfmadd231ps_fma(auVar233,auVar163,*(undefined1 (*) [16])(lVar9 + lVar82 * (uVar85 + 1)))
  ;
  auVar96 = vfmadd231ps_fma(auVar249,auVar163,*(undefined1 (*) [16])(lVar9 + lVar82 * (uVar85 + 2)))
  ;
  auVar101 = vfmadd231ps_fma(auVar180,auVar163,*(undefined1 (*) [16])(lVar9 + lVar82 * (uVar85 + 3))
                            );
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar91 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  _local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar92 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar98 = local_7a0._0_16_;
  local_a10 = vinsertps_avx512f(auVar92,auVar98,0x28);
  auVar259._0_4_ = auVar94._0_4_ + auVar95._0_4_ + auVar96._0_4_ + auVar101._0_4_;
  auVar259._4_4_ = auVar94._4_4_ + auVar95._4_4_ + auVar96._4_4_ + auVar101._4_4_;
  auVar259._8_4_ = auVar94._8_4_ + auVar95._8_4_ + auVar96._8_4_ + auVar101._8_4_;
  auVar259._12_4_ = auVar94._12_4_ + auVar95._12_4_ + auVar96._12_4_ + auVar101._12_4_;
  auVar34._8_4_ = 0x3e800000;
  auVar34._0_8_ = 0x3e8000003e800000;
  auVar34._12_4_ = 0x3e800000;
  auVar92 = vmulps_avx512vl(auVar259,auVar34);
  auVar92 = vsubps_avx(auVar92,auVar91);
  auVar92 = vdpps_avx(auVar92,local_a10,0x7f);
  fVar158 = *(float *)(ray + k * 4 + 0xc0);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar267._4_12_ = ZEXT812(0) << 0x20;
  auVar267._0_4_ = local_a20._0_4_;
  auVar93 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar267);
  auVar97 = vfnmadd213ss_fma(auVar93,local_a20,ZEXT416(0x40000000));
  local_5a0 = auVar92._0_4_ * auVar93._0_4_ * auVar97._0_4_;
  auVar268._4_4_ = local_5a0;
  auVar268._0_4_ = local_5a0;
  auVar268._8_4_ = local_5a0;
  auVar268._12_4_ = local_5a0;
  fStack_9d0 = local_5a0;
  _local_9e0 = auVar268;
  fStack_9cc = local_5a0;
  fStack_9c8 = local_5a0;
  fStack_9c4 = local_5a0;
  auVar92 = vfmadd231ps_fma(auVar91,local_a10,auVar268);
  auVar92 = vblendps_avx(auVar92,ZEXT816(0) << 0x40,8);
  auVar91 = vsubps_avx(auVar94,auVar92);
  auVar94 = vsubps_avx(auVar96,auVar92);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar92 = vsubps_avx(auVar101,auVar92);
  uVar177 = auVar91._0_4_;
  auVar279._4_4_ = uVar177;
  auVar279._0_4_ = uVar177;
  auVar279._8_4_ = uVar177;
  auVar279._12_4_ = uVar177;
  auVar279._16_4_ = uVar177;
  auVar279._20_4_ = uVar177;
  auVar279._24_4_ = uVar177;
  auVar279._28_4_ = uVar177;
  auVar110._8_4_ = 1;
  auVar110._0_8_ = 0x100000001;
  auVar110._12_4_ = 1;
  auVar110._16_4_ = 1;
  auVar110._20_4_ = 1;
  auVar110._24_4_ = 1;
  auVar110._28_4_ = 1;
  local_8a0 = ZEXT1632(auVar91);
  auVar27 = vpermps_avx2(auVar110,local_8a0);
  auVar111._8_4_ = 2;
  auVar111._0_8_ = 0x200000002;
  auVar111._12_4_ = 2;
  auVar111._16_4_ = 2;
  auVar111._20_4_ = 2;
  auVar111._24_4_ = 2;
  auVar111._28_4_ = 2;
  auVar28 = vpermps_avx2(auVar111,local_8a0);
  auVar114._8_4_ = 3;
  auVar114._0_8_ = 0x300000003;
  auVar114._12_4_ = 3;
  auVar114._16_4_ = 3;
  auVar114._20_4_ = 3;
  auVar114._24_4_ = 3;
  auVar114._28_4_ = 3;
  auVar106 = vpermps_avx512vl(auVar114,local_8a0);
  uVar177 = auVar95._0_4_;
  local_880._4_4_ = uVar177;
  local_880._0_4_ = uVar177;
  local_880._8_4_ = uVar177;
  local_880._12_4_ = uVar177;
  local_880._16_4_ = uVar177;
  local_880._20_4_ = uVar177;
  local_880._24_4_ = uVar177;
  local_880._28_4_ = uVar177;
  auVar272 = ZEXT3264(local_880);
  local_8e0 = ZEXT1632(auVar95);
  local_a00 = vpermps_avx2(auVar110,local_8e0);
  auVar29 = vpermps_avx2(auVar111,local_8e0);
  auVar107 = vpermps_avx512vl(auVar114,local_8e0);
  auVar108 = vbroadcastss_avx512vl(auVar94);
  local_8c0 = ZEXT1632(auVar94);
  local_aa0 = vpermps_avx512vl(auVar110,local_8c0);
  auVar284 = ZEXT3264(local_aa0);
  local_ac0 = vpermps_avx512vl(auVar111,local_8c0);
  auVar285 = ZEXT3264(local_ac0);
  auVar109 = vpermps_avx512vl(auVar114,local_8c0);
  auVar255 = ZEXT3264(local_a00);
  local_ae0 = vbroadcastss_avx512vl(auVar92);
  auVar286 = ZEXT3264(local_ae0);
  _local_900 = ZEXT1632(auVar92);
  auVar110 = vpermps_avx512vl(auVar110,_local_900);
  auVar111 = vpermps_avx512vl(auVar111,_local_900);
  local_b00 = vpermps_avx512vl(auVar114,_local_900);
  auVar287 = ZEXT3264(local_b00);
  auVar92 = vmulss_avx512f(auVar98,auVar98);
  auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar112,_local_760,_local_760);
  local_560._0_4_ = local_580._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar112);
  local_990 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar158 - local_5a0;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar174 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar174);
  uVar78 = 0;
  iVar79 = 1;
  auVar174 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar174);
  auVar92 = vsqrtss_avx(local_a20,local_a20);
  auVar91 = vsqrtss_avx(local_a20,local_a20);
  local_650 = ZEXT816(0x3f80000000000000);
  do {
    auVar94 = vmovshdup_avx(local_650);
    auVar94 = vsubps_avx(auVar94,local_650);
    fVar175 = auVar94._0_4_;
    fVar159 = fVar175 * 0.04761905;
    auVar246._0_4_ = local_650._0_4_;
    auVar246._4_4_ = auVar246._0_4_;
    auVar246._8_4_ = auVar246._0_4_;
    auVar246._12_4_ = auVar246._0_4_;
    auVar246._16_4_ = auVar246._0_4_;
    auVar246._20_4_ = auVar246._0_4_;
    auVar246._24_4_ = auVar246._0_4_;
    auVar246._28_4_ = auVar246._0_4_;
    auVar264._4_4_ = fVar175;
    auVar264._0_4_ = fVar175;
    auVar264._8_4_ = fVar175;
    auVar264._12_4_ = fVar175;
    auVar264._16_4_ = fVar175;
    auVar264._20_4_ = fVar175;
    auVar264._24_4_ = fVar175;
    auVar264._28_4_ = fVar175;
    auVar94 = vfmadd231ps_fma(auVar246,auVar264,_DAT_01faff20);
    auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar112 = vsubps_avx512vl(auVar113,ZEXT1632(auVar94));
    fVar175 = auVar94._0_4_;
    fVar196 = auVar94._4_4_;
    auVar127._4_4_ = auVar272._4_4_ * fVar196;
    auVar127._0_4_ = auVar272._0_4_ * fVar175;
    fVar198 = auVar94._8_4_;
    auVar127._8_4_ = auVar272._8_4_ * fVar198;
    fVar200 = auVar94._12_4_;
    auVar127._12_4_ = auVar272._12_4_ * fVar200;
    auVar127._16_4_ = auVar272._16_4_ * 0.0;
    auVar127._20_4_ = auVar272._20_4_ * 0.0;
    auVar127._24_4_ = auVar272._24_4_ * 0.0;
    auVar127._28_4_ = DAT_01faff20._28_4_;
    auVar115._4_4_ = auVar255._4_4_ * fVar196;
    auVar115._0_4_ = auVar255._0_4_ * fVar175;
    auVar115._8_4_ = auVar255._8_4_ * fVar198;
    auVar115._12_4_ = auVar255._12_4_ * fVar200;
    auVar115._16_4_ = auVar255._16_4_ * 0.0;
    auVar115._20_4_ = auVar255._20_4_ * 0.0;
    auVar115._24_4_ = auVar255._24_4_ * 0.0;
    auVar115._28_4_ = auVar246._0_4_;
    auVar174._0_4_ = auVar29._0_4_ * fVar175;
    auVar174._4_4_ = auVar29._4_4_ * fVar196;
    auVar174._8_4_ = auVar29._8_4_ * fVar198;
    auVar174._12_4_ = auVar29._12_4_ * fVar200;
    auVar174._16_4_ = auVar29._16_4_ * 0.0;
    auVar174._20_4_ = auVar29._20_4_ * 0.0;
    auVar174._28_36_ = auVar255._28_36_;
    auVar174._24_4_ = auVar29._24_4_ * 0.0;
    auVar114 = vmulps_avx512vl(auVar107,ZEXT1632(auVar94));
    auVar95 = vfmadd231ps_fma(auVar127,auVar112,auVar279);
    auVar96 = vfmadd231ps_fma(auVar115,auVar112,auVar27);
    auVar101 = vfmadd231ps_fma(auVar174._0_32_,auVar112,auVar28);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,auVar106);
    auVar115 = vmulps_avx512vl(auVar108,ZEXT1632(auVar94));
    auVar122 = ZEXT1632(auVar94);
    auVar116 = vmulps_avx512vl(auVar284._0_32_,auVar122);
    auVar117 = vmulps_avx512vl(auVar285._0_32_,auVar122);
    auVar118 = vmulps_avx512vl(auVar109,auVar122);
    auVar97 = vfmadd231ps_fma(auVar115,auVar112,auVar272._0_32_);
    auVar93 = vfmadd231ps_fma(auVar116,auVar112,auVar255._0_32_);
    auVar98 = vfmadd231ps_fma(auVar117,auVar112,auVar29);
    auVar115 = vfmadd231ps_avx512vl(auVar118,auVar112,auVar107);
    auVar116 = vmulps_avx512vl(auVar286._0_32_,auVar122);
    auVar117 = vmulps_avx512vl(auVar110,auVar122);
    auVar118 = vmulps_avx512vl(auVar111,auVar122);
    auVar119 = vmulps_avx512vl(auVar287._0_32_,auVar122);
    auVar120 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar108);
    auVar121 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar284._0_32_);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar112,auVar285._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar112,auVar109);
    auVar128._28_4_ = auVar29._28_4_;
    auVar128._0_28_ =
         ZEXT1628(CONCAT412(fVar200 * auVar97._12_4_,
                            CONCAT48(fVar198 * auVar97._8_4_,
                                     CONCAT44(fVar196 * auVar97._4_4_,fVar175 * auVar97._0_4_))));
    auVar116 = vmulps_avx512vl(auVar122,ZEXT1632(auVar93));
    auVar117 = vmulps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar98));
    auVar122 = vmulps_avx512vl(ZEXT1632(auVar94),auVar115);
    auVar94 = vfmadd231ps_fma(auVar128,auVar112,ZEXT1632(auVar95));
    auVar123 = vfmadd231ps_avx512vl(auVar116,auVar112,ZEXT1632(auVar96));
    auVar124 = vfmadd231ps_avx512vl(auVar117,auVar112,ZEXT1632(auVar101));
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar112,auVar114);
    auVar116._4_4_ = auVar120._4_4_ * fVar196;
    auVar116._0_4_ = auVar120._0_4_ * fVar175;
    auVar116._8_4_ = auVar120._8_4_ * fVar198;
    auVar116._12_4_ = auVar120._12_4_ * fVar200;
    auVar116._16_4_ = auVar120._16_4_ * 0.0;
    auVar116._20_4_ = auVar120._20_4_ * 0.0;
    auVar116._24_4_ = auVar120._24_4_ * 0.0;
    auVar116._28_4_ = auVar114._28_4_;
    auVar117._4_4_ = auVar121._4_4_ * fVar196;
    auVar117._0_4_ = auVar121._0_4_ * fVar175;
    auVar117._8_4_ = auVar121._8_4_ * fVar198;
    auVar117._12_4_ = auVar121._12_4_ * fVar200;
    auVar117._16_4_ = auVar121._16_4_ * 0.0;
    auVar117._20_4_ = auVar121._20_4_ * 0.0;
    auVar117._24_4_ = auVar121._24_4_ * 0.0;
    auVar117._28_4_ = auVar120._28_4_;
    auVar125._4_4_ = auVar118._4_4_ * fVar196;
    auVar125._0_4_ = auVar118._0_4_ * fVar175;
    auVar125._8_4_ = auVar118._8_4_ * fVar198;
    auVar125._12_4_ = auVar118._12_4_ * fVar200;
    auVar125._16_4_ = auVar118._16_4_ * 0.0;
    auVar125._20_4_ = auVar118._20_4_ * 0.0;
    auVar125._24_4_ = auVar118._24_4_ * 0.0;
    auVar125._28_4_ = auVar121._28_4_;
    auVar126._4_4_ = auVar119._4_4_ * fVar196;
    auVar126._0_4_ = auVar119._0_4_ * fVar175;
    auVar126._8_4_ = auVar119._8_4_ * fVar198;
    auVar126._12_4_ = auVar119._12_4_ * fVar200;
    auVar126._16_4_ = auVar119._16_4_ * 0.0;
    auVar126._20_4_ = auVar119._20_4_ * 0.0;
    auVar126._24_4_ = auVar119._24_4_ * 0.0;
    auVar126._28_4_ = auVar118._28_4_;
    auVar95 = vfmadd231ps_fma(auVar116,auVar112,ZEXT1632(auVar97));
    auVar96 = vfmadd231ps_fma(auVar117,auVar112,ZEXT1632(auVar93));
    auVar101 = vfmadd231ps_fma(auVar125,auVar112,ZEXT1632(auVar98));
    auVar97 = vfmadd231ps_fma(auVar126,auVar112,auVar115);
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar95._12_4_,
                                                 CONCAT48(fVar198 * auVar95._8_4_,
                                                          CONCAT44(fVar196 * auVar95._4_4_,
                                                                   fVar175 * auVar95._0_4_)))),
                              auVar112,ZEXT1632(auVar94));
    auVar125 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar96._12_4_ * fVar200,
                                             CONCAT48(auVar96._8_4_ * fVar198,
                                                      CONCAT44(auVar96._4_4_ * fVar196,
                                                               auVar96._0_4_ * fVar175)))),auVar112,
                          auVar123);
    auVar126 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar101._12_4_ * fVar200,
                                             CONCAT48(auVar101._8_4_ * fVar198,
                                                      CONCAT44(auVar101._4_4_ * fVar196,
                                                               auVar101._0_4_ * fVar175)))),auVar112
                          ,auVar124);
    auVar114 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar97._12_4_ * fVar200,
                                             CONCAT48(auVar97._8_4_ * fVar198,
                                                      CONCAT44(auVar97._4_4_ * fVar196,
                                                               auVar97._0_4_ * fVar175)))),auVar122,
                          auVar112);
    auVar112 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar94));
    auVar115 = vsubps_avx512vl(ZEXT1632(auVar96),auVar123);
    auVar116 = vsubps_avx512vl(ZEXT1632(auVar101),auVar124);
    auVar117 = vsubps_avx512vl(ZEXT1632(auVar97),auVar122);
    auVar143._0_4_ = fVar159 * auVar112._0_4_ * 3.0;
    auVar143._4_4_ = fVar159 * auVar112._4_4_ * 3.0;
    auVar143._8_4_ = fVar159 * auVar112._8_4_ * 3.0;
    auVar143._12_4_ = fVar159 * auVar112._12_4_ * 3.0;
    auVar143._16_4_ = fVar159 * auVar112._16_4_ * 3.0;
    auVar143._20_4_ = fVar159 * auVar112._20_4_ * 3.0;
    auVar143._24_4_ = fVar159 * auVar112._24_4_ * 3.0;
    auVar143._28_4_ = 0;
    auVar282._0_4_ = fVar159 * auVar115._0_4_ * 3.0;
    auVar282._4_4_ = fVar159 * auVar115._4_4_ * 3.0;
    auVar282._8_4_ = fVar159 * auVar115._8_4_ * 3.0;
    auVar282._12_4_ = fVar159 * auVar115._12_4_ * 3.0;
    auVar282._16_4_ = fVar159 * auVar115._16_4_ * 3.0;
    auVar282._20_4_ = fVar159 * auVar115._20_4_ * 3.0;
    auVar282._24_4_ = fVar159 * auVar115._24_4_ * 3.0;
    auVar282._28_4_ = 0;
    auVar123._4_4_ = fVar159 * auVar116._4_4_ * 3.0;
    auVar123._0_4_ = fVar159 * auVar116._0_4_ * 3.0;
    auVar123._8_4_ = fVar159 * auVar116._8_4_ * 3.0;
    auVar123._12_4_ = fVar159 * auVar116._12_4_ * 3.0;
    auVar123._16_4_ = fVar159 * auVar116._16_4_ * 3.0;
    auVar123._20_4_ = fVar159 * auVar116._20_4_ * 3.0;
    auVar123._24_4_ = fVar159 * auVar116._24_4_ * 3.0;
    auVar123._28_4_ = auVar119._28_4_;
    fVar175 = auVar117._0_4_ * 3.0 * fVar159;
    fVar196 = auVar117._4_4_ * 3.0 * fVar159;
    auVar124._4_4_ = fVar196;
    auVar124._0_4_ = fVar175;
    fVar198 = auVar117._8_4_ * 3.0 * fVar159;
    auVar124._8_4_ = fVar198;
    fVar200 = auVar117._12_4_ * 3.0 * fVar159;
    auVar124._12_4_ = fVar200;
    fVar202 = auVar117._16_4_ * 3.0 * fVar159;
    auVar124._16_4_ = fVar202;
    fVar204 = auVar117._20_4_ * 3.0 * fVar159;
    auVar124._20_4_ = fVar204;
    fVar206 = auVar117._24_4_ * 3.0 * fVar159;
    auVar124._24_4_ = fVar206;
    auVar124._28_4_ = fVar159;
    auVar94 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar94);
    auVar127 = vpermt2ps_avx512vl(ZEXT1632(auVar93),_DAT_01feed00,ZEXT1632(auVar94));
    auVar128 = vpermt2ps_avx512vl(auVar125,_DAT_01feed00,ZEXT1632(auVar94));
    auVar115 = ZEXT1632(auVar94);
    auVar129 = vpermt2ps_avx512vl(auVar126,_DAT_01feed00,auVar115);
    auVar130._0_4_ = auVar114._0_4_ + fVar175;
    auVar130._4_4_ = auVar114._4_4_ + fVar196;
    auVar130._8_4_ = auVar114._8_4_ + fVar198;
    auVar130._12_4_ = auVar114._12_4_ + fVar200;
    auVar130._16_4_ = auVar114._16_4_ + fVar202;
    auVar130._20_4_ = auVar114._20_4_ + fVar204;
    auVar130._24_4_ = auVar114._24_4_ + fVar206;
    auVar130._28_4_ = auVar114._28_4_ + fVar159;
    auVar112 = vmaxps_avx(auVar114,auVar130);
    auVar118 = vminps_avx512vl(auVar114,auVar130);
    auVar119 = vpermt2ps_avx512vl(auVar114,_DAT_01feed00,auVar115);
    auVar130 = vpermt2ps_avx512vl(auVar143,_DAT_01feed00,auVar115);
    auVar131 = vpermt2ps_avx512vl(auVar282,_DAT_01feed00,auVar115);
    auVar138 = ZEXT1632(auVar94);
    auVar132 = vpermt2ps_avx512vl(auVar123,_DAT_01feed00,auVar138);
    auVar114 = vpermt2ps_avx512vl(auVar124,_DAT_01feed00,auVar138);
    auVar114 = vsubps_avx(auVar119,auVar114);
    auVar115 = vsubps_avx(auVar127,ZEXT1632(auVar93));
    auVar116 = vsubps_avx(auVar128,auVar125);
    auVar117 = vsubps_avx(auVar129,auVar126);
    auVar120 = vmulps_avx512vl(auVar116,auVar123);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar282,auVar117);
    auVar121 = vmulps_avx512vl(auVar117,auVar143);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar123,auVar115);
    auVar122 = vmulps_avx512vl(auVar115,auVar282);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar143,auVar116);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar121 = vmulps_avx512vl(auVar117,auVar117);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar116,auVar116);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar115,auVar115);
    auVar122 = vrcp14ps_avx512vl(auVar121);
    auVar124 = vfnmadd213ps_avx512vl(auVar122,auVar121,auVar113);
    auVar122 = vfmadd132ps_avx512vl(auVar124,auVar122,auVar122);
    auVar120 = vmulps_avx512vl(auVar120,auVar122);
    auVar124 = vmulps_avx512vl(auVar116,auVar132);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar131,auVar117);
    auVar133 = vmulps_avx512vl(auVar117,auVar130);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar132,auVar115);
    auVar134 = vmulps_avx512vl(auVar115,auVar131);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar130,auVar116);
    auVar134 = vmulps_avx512vl(auVar134,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar133,auVar133);
    auVar124 = vfmadd231ps_avx512vl(auVar133,auVar124,auVar124);
    auVar122 = vmulps_avx512vl(auVar124,auVar122);
    auVar120 = vmaxps_avx512vl(auVar120,auVar122);
    auVar120 = vsqrtps_avx512vl(auVar120);
    auVar122 = vmaxps_avx512vl(auVar114,auVar119);
    auVar112 = vmaxps_avx512vl(auVar112,auVar122);
    auVar122 = vaddps_avx512vl(auVar120,auVar112);
    auVar112 = vminps_avx(auVar114,auVar119);
    auVar112 = vminps_avx512vl(auVar118,auVar112);
    auVar112 = vsubps_avx512vl(auVar112,auVar120);
    auVar118._8_4_ = 0x3f800002;
    auVar118._0_8_ = 0x3f8000023f800002;
    auVar118._12_4_ = 0x3f800002;
    auVar118._16_4_ = 0x3f800002;
    auVar118._20_4_ = 0x3f800002;
    auVar118._24_4_ = 0x3f800002;
    auVar118._28_4_ = 0x3f800002;
    auVar114 = vmulps_avx512vl(auVar122,auVar118);
    auVar119._8_4_ = 0x3f7ffffc;
    auVar119._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar119._12_4_ = 0x3f7ffffc;
    auVar119._16_4_ = 0x3f7ffffc;
    auVar119._20_4_ = 0x3f7ffffc;
    auVar119._24_4_ = 0x3f7ffffc;
    auVar119._28_4_ = 0x3f7ffffc;
    local_a80 = vmulps_avx512vl(auVar112,auVar119);
    auVar112 = vmulps_avx512vl(auVar114,auVar114);
    auVar114 = vrsqrt14ps_avx512vl(auVar121);
    auVar120._8_4_ = 0xbf000000;
    auVar120._0_8_ = 0xbf000000bf000000;
    auVar120._12_4_ = 0xbf000000;
    auVar120._16_4_ = 0xbf000000;
    auVar120._20_4_ = 0xbf000000;
    auVar120._24_4_ = 0xbf000000;
    auVar120._28_4_ = 0xbf000000;
    auVar118 = vmulps_avx512vl(auVar121,auVar120);
    fVar175 = auVar114._0_4_;
    fVar196 = auVar114._4_4_;
    fVar198 = auVar114._8_4_;
    fVar200 = auVar114._12_4_;
    fVar159 = auVar114._16_4_;
    fVar202 = auVar114._20_4_;
    fVar204 = auVar114._24_4_;
    auVar133._4_4_ = fVar196 * fVar196 * fVar196 * auVar118._4_4_;
    auVar133._0_4_ = fVar175 * fVar175 * fVar175 * auVar118._0_4_;
    auVar133._8_4_ = fVar198 * fVar198 * fVar198 * auVar118._8_4_;
    auVar133._12_4_ = fVar200 * fVar200 * fVar200 * auVar118._12_4_;
    auVar133._16_4_ = fVar159 * fVar159 * fVar159 * auVar118._16_4_;
    auVar133._20_4_ = fVar202 * fVar202 * fVar202 * auVar118._20_4_;
    auVar133._24_4_ = fVar204 * fVar204 * fVar204 * auVar118._24_4_;
    auVar133._28_4_ = auVar122._28_4_;
    auVar121._8_4_ = 0x3fc00000;
    auVar121._0_8_ = 0x3fc000003fc00000;
    auVar121._12_4_ = 0x3fc00000;
    auVar121._16_4_ = 0x3fc00000;
    auVar121._20_4_ = 0x3fc00000;
    auVar121._24_4_ = 0x3fc00000;
    auVar121._28_4_ = 0x3fc00000;
    auVar114 = vfmadd231ps_avx512vl(auVar133,auVar114,auVar121);
    auVar118 = vmulps_avx512vl(auVar115,auVar114);
    auVar119 = vmulps_avx512vl(auVar116,auVar114);
    auVar120 = vmulps_avx512vl(auVar117,auVar114);
    auVar254 = ZEXT1632(auVar93);
    auVar121 = vsubps_avx512vl(auVar138,auVar254);
    auVar124 = vsubps_avx512vl(auVar138,auVar125);
    auVar133 = vsubps_avx512vl(auVar138,auVar126);
    auVar122 = vmulps_avx512vl(local_7a0,auVar133);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_780,auVar124);
    auVar122 = vfmadd231ps_avx512vl(auVar122,_local_760,auVar121);
    auVar134 = vmulps_avx512vl(auVar133,auVar133);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar124,auVar124);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar121,auVar121);
    auVar135 = vmulps_avx512vl(local_7a0,auVar120);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar119,local_780);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar118,_local_760);
    auVar120 = vmulps_avx512vl(auVar133,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar124,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar121,auVar118);
    auVar119 = vmulps_avx512vl(auVar135,auVar135);
    auVar120 = vsubps_avx512vl(local_560,auVar119);
    auVar136 = vmulps_avx512vl(auVar135,auVar118);
    auVar122 = vsubps_avx512vl(auVar122,auVar136);
    auVar136 = vaddps_avx512vl(auVar122,auVar122);
    auVar122 = vmulps_avx512vl(auVar118,auVar118);
    auVar134 = vsubps_avx512vl(auVar134,auVar122);
    auVar112 = vsubps_avx512vl(auVar134,auVar112);
    local_7c0 = vmulps_avx512vl(auVar136,auVar136);
    auVar122._8_4_ = 0x40800000;
    auVar122._0_8_ = 0x4080000040800000;
    auVar122._12_4_ = 0x40800000;
    auVar122._16_4_ = 0x40800000;
    auVar122._20_4_ = 0x40800000;
    auVar122._24_4_ = 0x40800000;
    auVar122._28_4_ = 0x40800000;
    _local_7e0 = vmulps_avx512vl(auVar120,auVar122);
    auVar122 = vmulps_avx512vl(_local_7e0,auVar112);
    auVar122 = vsubps_avx512vl(local_7c0,auVar122);
    uVar85 = vcmpps_avx512vl(auVar122,auVar138,5);
    bVar71 = (byte)uVar85;
    fVar175 = (float)local_9e0._0_4_;
    fVar196 = (float)local_9e0._4_4_;
    fVar198 = fStack_9d8;
    fVar200 = fStack_9d4;
    fVar159 = fStack_9d0;
    fVar202 = fStack_9cc;
    fVar204 = fStack_9c8;
    fVar206 = fStack_9c4;
    if (bVar71 == 0) {
LAB_01b72810:
      auVar272 = ZEXT3264(local_880);
      auVar255 = ZEXT3264(local_a00);
      auVar284 = ZEXT3264(local_aa0);
      auVar285 = ZEXT3264(local_ac0);
      auVar286 = ZEXT3264(local_ae0);
      auVar287 = ZEXT3264(local_b00);
    }
    else {
      local_740._0_32_ = auVar134;
      auVar122 = vsqrtps_avx512vl(auVar122);
      auVar137 = vaddps_avx512vl(auVar120,auVar120);
      local_860 = vrcp14ps_avx512vl(auVar137);
      in_ZMM31 = ZEXT3264(local_860);
      auVar113 = vfnmadd213ps_avx512vl(local_860,auVar137,auVar113);
      auVar138 = vfmadd132ps_avx512vl(auVar113,local_860,local_860);
      auVar113._8_4_ = 0x80000000;
      auVar113._0_8_ = 0x8000000080000000;
      auVar113._12_4_ = 0x80000000;
      auVar113._16_4_ = 0x80000000;
      auVar113._20_4_ = 0x80000000;
      auVar113._24_4_ = 0x80000000;
      auVar113._28_4_ = 0x80000000;
      local_800 = vxorps_avx512vl(auVar136,auVar113);
      auVar113 = vsubps_avx512vl(local_800,auVar122);
      local_9c0 = vmulps_avx512vl(auVar113,auVar138);
      auVar122 = vsubps_avx512vl(auVar122,auVar136);
      local_a40 = vmulps_avx512vl(auVar122,auVar138);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar122,local_9c0);
      auVar139._0_4_ =
           (uint)(bVar71 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar122._0_4_;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar122._4_4_;
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar122._8_4_;
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar122._12_4_;
      bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar139._16_4_ = (uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar122._16_4_;
      bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar139._20_4_ = (uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar122._20_4_;
      bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar139._24_4_ = (uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar122._24_4_;
      bVar13 = SUB81(uVar85 >> 7,0);
      auVar139._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar122._28_4_;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar122,local_a40);
      auVar140._0_4_ =
           (uint)(bVar71 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar122._0_4_;
      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar122._4_4_;
      bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar122._8_4_;
      bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar122._12_4_;
      bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar140._16_4_ = (uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar122._16_4_;
      bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar140._20_4_ = (uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar122._20_4_;
      bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar140._24_4_ = (uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar122._24_4_;
      bVar13 = SUB81(uVar85 >> 7,0);
      auVar140._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar122._28_4_;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar119,auVar122);
      local_820 = vmaxps_avx512vl(local_580,auVar122);
      auVar138._8_4_ = 0x36000000;
      auVar138._0_8_ = 0x3600000036000000;
      auVar138._12_4_ = 0x36000000;
      auVar138._16_4_ = 0x36000000;
      auVar138._20_4_ = 0x36000000;
      auVar138._24_4_ = 0x36000000;
      auVar138._28_4_ = 0x36000000;
      local_840 = vmulps_avx512vl(local_820,auVar138);
      vandps_avx512vl(auVar120,auVar122);
      uVar74 = vcmpps_avx512vl(local_840,local_840,1);
      uVar85 = uVar85 & uVar74;
      bVar76 = (byte)uVar85;
      if (bVar76 != 0) {
        uVar74 = vcmpps_avx512vl(auVar112,_DAT_01faff00,2);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar120 = vblendmps_avx512vl(auVar112,auVar119);
        bVar77 = (byte)uVar74;
        uVar87 = (uint)(bVar77 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar77 & 1) * local_840._0_4_;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        uVar86 = (uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * local_840._4_4_;
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        uVar151 = (uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * local_840._8_4_;
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        uVar152 = (uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * local_840._12_4_;
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        uVar153 = (uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * local_840._16_4_;
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        uVar154 = (uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * local_840._20_4_;
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        uVar155 = (uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * local_840._24_4_;
        bVar13 = SUB81(uVar74 >> 7,0);
        uVar156 = (uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * local_840._28_4_;
        auVar139._0_4_ = (bVar76 & 1) * uVar87 | !(bool)(bVar76 & 1) * auVar139._0_4_;
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar139._4_4_ = bVar13 * uVar86 | !bVar13 * auVar139._4_4_;
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar139._8_4_ = bVar13 * uVar151 | !bVar13 * auVar139._8_4_;
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar139._12_4_ = bVar13 * uVar152 | !bVar13 * auVar139._12_4_;
        bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar139._16_4_ = bVar13 * uVar153 | !bVar13 * auVar139._16_4_;
        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar139._20_4_ = bVar13 * uVar154 | !bVar13 * auVar139._20_4_;
        bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar139._24_4_ = bVar13 * uVar155 | !bVar13 * auVar139._24_4_;
        bVar13 = SUB81(uVar85 >> 7,0);
        auVar139._28_4_ = bVar13 * uVar156 | !bVar13 * auVar139._28_4_;
        auVar112 = vblendmps_avx512vl(auVar119,auVar112);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar74 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar74 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar74 >> 6) & 1);
        bVar20 = SUB81(uVar74 >> 7,0);
        auVar140._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar77 & 1) * auVar112._0_4_ | !(bool)(bVar77 & 1) * uVar87) |
             !(bool)(bVar76 & 1) * auVar140._0_4_;
        bVar14 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar140._4_4_ =
             (uint)bVar14 * ((uint)bVar13 * auVar112._4_4_ | !bVar13 * uVar86) |
             !bVar14 * auVar140._4_4_;
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar140._8_4_ =
             (uint)bVar13 * ((uint)bVar15 * auVar112._8_4_ | !bVar15 * uVar151) |
             !bVar13 * auVar140._8_4_;
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar140._12_4_ =
             (uint)bVar13 * ((uint)bVar16 * auVar112._12_4_ | !bVar16 * uVar152) |
             !bVar13 * auVar140._12_4_;
        bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar140._16_4_ =
             (uint)bVar13 * ((uint)bVar17 * auVar112._16_4_ | !bVar17 * uVar153) |
             !bVar13 * auVar140._16_4_;
        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar140._20_4_ =
             (uint)bVar13 * ((uint)bVar18 * auVar112._20_4_ | !bVar18 * uVar154) |
             !bVar13 * auVar140._20_4_;
        bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar140._24_4_ =
             (uint)bVar13 * ((uint)bVar19 * auVar112._24_4_ | !bVar19 * uVar155) |
             !bVar13 * auVar140._24_4_;
        bVar13 = SUB81(uVar85 >> 7,0);
        auVar140._28_4_ =
             (uint)bVar13 * ((uint)bVar20 * auVar112._28_4_ | !bVar20 * uVar156) |
             !bVar13 * auVar140._28_4_;
        bVar71 = (~bVar76 | bVar77) & bVar71;
      }
      if ((bVar71 & 0x7f) == 0) goto LAB_01b72810;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar132,auVar122);
      auVar130 = vxorps_avx512vl(auVar130,auVar122);
      uVar87 = *(uint *)(ray + k * 4 + 0x200);
      auVar138 = vxorps_avx512vl(auVar131,auVar122);
      auVar94 = vsubss_avx512f(ZEXT416(uVar87),ZEXT416((uint)local_990._0_4_));
      auVar112 = vbroadcastss_avx512vl(auVar94);
      auVar140 = vminps_avx512vl(auVar112,auVar140);
      auVar132._4_4_ = fStack_59c;
      auVar132._0_4_ = local_5a0;
      auVar132._8_4_ = fStack_598;
      auVar132._12_4_ = fStack_594;
      auVar132._16_4_ = fStack_590;
      auVar132._20_4_ = fStack_58c;
      auVar132._24_4_ = fStack_588;
      auVar132._28_4_ = fStack_584;
      auVar112 = vmaxps_avx512vl(auVar132,auVar139);
      auVar119 = vmulps_avx512vl(auVar133,auVar123);
      auVar119 = vfmadd213ps_avx512vl(auVar124,auVar282,auVar119);
      auVar94 = vfmadd213ps_fma(auVar121,auVar143,auVar119);
      in_ZMM31 = ZEXT3264(local_7a0);
      auVar119 = vmulps_avx512vl(local_7a0,auVar123);
      auVar119 = vfmadd231ps_avx512vl(auVar119,local_780,auVar282);
      auVar95 = vfmadd231ps_fma(auVar119,_local_760,auVar143);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar95),auVar121);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar30 = vcmpps_avx512vl(auVar121,auVar123,1);
      auVar119 = vxorps_avx512vl(ZEXT1632(auVar94),auVar122);
      auVar120 = vrcp14ps_avx512vl(ZEXT1632(auVar95));
      auVar143 = ZEXT1632(auVar95);
      auVar124 = vxorps_avx512vl(auVar143,auVar122);
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar131 = vfnmadd213ps_avx512vl(auVar120,auVar143,auVar133);
      auVar94 = vfmadd132ps_fma(auVar131,auVar120,auVar120);
      fVar176 = auVar94._0_4_ * auVar119._0_4_;
      fVar197 = auVar94._4_4_ * auVar119._4_4_;
      auVar131._4_4_ = fVar197;
      auVar131._0_4_ = fVar176;
      fVar199 = auVar94._8_4_ * auVar119._8_4_;
      auVar131._8_4_ = fVar199;
      fVar201 = auVar94._12_4_ * auVar119._12_4_;
      auVar131._12_4_ = fVar201;
      fVar203 = auVar119._16_4_ * 0.0;
      auVar131._16_4_ = fVar203;
      fVar205 = auVar119._20_4_ * 0.0;
      auVar131._20_4_ = fVar205;
      fVar207 = auVar119._24_4_ * 0.0;
      auVar131._24_4_ = fVar207;
      auVar131._28_4_ = auVar119._28_4_;
      uVar31 = vcmpps_avx512vl(auVar143,auVar124,1);
      bVar76 = (byte)uVar30 | (byte)uVar31;
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar131 = vblendmps_avx512vl(auVar131,auVar132);
      auVar141._0_4_ =
           (uint)(bVar76 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar120._0_4_;
      bVar13 = (bool)(bVar76 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * auVar120._4_4_;
      bVar13 = (bool)(bVar76 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * auVar120._8_4_;
      bVar13 = (bool)(bVar76 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * auVar120._12_4_;
      bVar13 = (bool)(bVar76 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar13 * auVar131._16_4_ | (uint)!bVar13 * auVar120._16_4_;
      bVar13 = (bool)(bVar76 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar13 * auVar131._20_4_ | (uint)!bVar13 * auVar120._20_4_;
      bVar13 = (bool)(bVar76 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar13 * auVar131._24_4_ | (uint)!bVar13 * auVar120._24_4_;
      auVar141._28_4_ =
           (uint)(bVar76 >> 7) * auVar131._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar120._28_4_;
      auVar131 = vmaxps_avx512vl(auVar112,auVar141);
      uVar31 = vcmpps_avx512vl(auVar143,auVar124,6);
      bVar76 = (byte)uVar30 | (byte)uVar31;
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar142._0_4_ =
           (uint)(bVar76 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar76 & 1) * (int)fVar176;
      bVar13 = (bool)(bVar76 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar13 * auVar124._4_4_ | (uint)!bVar13 * (int)fVar197;
      bVar13 = (bool)(bVar76 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar13 * auVar124._8_4_ | (uint)!bVar13 * (int)fVar199;
      bVar13 = (bool)(bVar76 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar13 * auVar124._12_4_ | (uint)!bVar13 * (int)fVar201;
      bVar13 = (bool)(bVar76 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar13 * auVar124._16_4_ | (uint)!bVar13 * (int)fVar203;
      bVar13 = (bool)(bVar76 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar13 * auVar124._20_4_ | (uint)!bVar13 * (int)fVar205;
      bVar13 = (bool)(bVar76 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar13 * auVar124._24_4_ | (uint)!bVar13 * (int)fVar207;
      auVar142._28_4_ =
           (uint)(bVar76 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar119._28_4_;
      auVar143 = vminps_avx512vl(auVar140,auVar142);
      auVar112 = vsubps_avx(ZEXT832(0) << 0x20,auVar127);
      auVar119 = vsubps_avx(ZEXT832(0) << 0x20,auVar128);
      auVar127 = ZEXT832(0) << 0x20;
      auVar120 = vsubps_avx(auVar127,auVar129);
      auVar120 = vmulps_avx512vl(auVar120,auVar113);
      auVar119 = vfmadd231ps_avx512vl(auVar120,auVar138,auVar119);
      auVar112 = vfmadd231ps_avx512vl(auVar119,auVar130,auVar112);
      auVar119 = vmulps_avx512vl(local_7a0,auVar113);
      auVar119 = vfmadd231ps_avx512vl(auVar119,local_780,auVar138);
      auVar119 = vfmadd231ps_avx512vl(auVar119,_local_760,auVar130);
      vandps_avx512vl(auVar119,auVar121);
      uVar30 = vcmpps_avx512vl(auVar119,auVar123,1);
      auVar112 = vxorps_avx512vl(auVar112,auVar122);
      auVar120 = vrcp14ps_avx512vl(auVar119);
      auVar121 = vxorps_avx512vl(auVar119,auVar122);
      auVar122 = vfnmadd213ps_avx512vl(auVar120,auVar119,auVar133);
      auVar94 = vfmadd132ps_fma(auVar122,auVar120,auVar120);
      fVar176 = auVar94._0_4_ * auVar112._0_4_;
      fVar197 = auVar94._4_4_ * auVar112._4_4_;
      auVar129._4_4_ = fVar197;
      auVar129._0_4_ = fVar176;
      fVar199 = auVar94._8_4_ * auVar112._8_4_;
      auVar129._8_4_ = fVar199;
      fVar201 = auVar94._12_4_ * auVar112._12_4_;
      auVar129._12_4_ = fVar201;
      fVar203 = auVar112._16_4_ * 0.0;
      auVar129._16_4_ = fVar203;
      fVar205 = auVar112._20_4_ * 0.0;
      auVar129._20_4_ = fVar205;
      fVar207 = auVar112._24_4_ * 0.0;
      auVar129._24_4_ = fVar207;
      auVar129._28_4_ = auVar112._28_4_;
      uVar31 = vcmpps_avx512vl(auVar119,auVar121,1);
      bVar76 = (byte)uVar30 | (byte)uVar31;
      auVar122 = vblendmps_avx512vl(auVar129,auVar132);
      auVar144._0_4_ =
           (uint)(bVar76 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar120._0_4_;
      bVar13 = (bool)(bVar76 >> 1 & 1);
      auVar144._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar120._4_4_;
      bVar13 = (bool)(bVar76 >> 2 & 1);
      auVar144._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar120._8_4_;
      bVar13 = (bool)(bVar76 >> 3 & 1);
      auVar144._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar120._12_4_;
      bVar13 = (bool)(bVar76 >> 4 & 1);
      auVar144._16_4_ = (uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * auVar120._16_4_;
      bVar13 = (bool)(bVar76 >> 5 & 1);
      auVar144._20_4_ = (uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * auVar120._20_4_;
      bVar13 = (bool)(bVar76 >> 6 & 1);
      auVar144._24_4_ = (uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * auVar120._24_4_;
      auVar144._28_4_ =
           (uint)(bVar76 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar120._28_4_;
      _local_920 = vmaxps_avx(auVar131,auVar144);
      uVar31 = vcmpps_avx512vl(auVar119,auVar121,6);
      bVar76 = (byte)uVar30 | (byte)uVar31;
      auVar145._0_4_ =
           (uint)(bVar76 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar76 & 1) * (int)fVar176;
      bVar13 = (bool)(bVar76 >> 1 & 1);
      auVar145._4_4_ = (uint)bVar13 * auVar124._4_4_ | (uint)!bVar13 * (int)fVar197;
      bVar13 = (bool)(bVar76 >> 2 & 1);
      auVar145._8_4_ = (uint)bVar13 * auVar124._8_4_ | (uint)!bVar13 * (int)fVar199;
      bVar13 = (bool)(bVar76 >> 3 & 1);
      auVar145._12_4_ = (uint)bVar13 * auVar124._12_4_ | (uint)!bVar13 * (int)fVar201;
      bVar13 = (bool)(bVar76 >> 4 & 1);
      auVar145._16_4_ = (uint)bVar13 * auVar124._16_4_ | (uint)!bVar13 * (int)fVar203;
      bVar13 = (bool)(bVar76 >> 5 & 1);
      auVar145._20_4_ = (uint)bVar13 * auVar124._20_4_ | (uint)!bVar13 * (int)fVar205;
      bVar13 = (bool)(bVar76 >> 6 & 1);
      auVar145._24_4_ = (uint)bVar13 * auVar124._24_4_ | (uint)!bVar13 * (int)fVar207;
      auVar145._28_4_ =
           (uint)(bVar76 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar112._28_4_;
      local_600 = vminps_avx(auVar143,auVar145);
      uVar30 = vcmpps_avx512vl(_local_920,local_600,2);
      bVar71 = bVar71 & 0x7f & (byte)uVar30;
      if (bVar71 == 0) goto LAB_01b72810;
      auVar112 = vmaxps_avx(auVar127,local_a80);
      auVar119 = vfmadd213ps_avx512vl(local_9c0,auVar135,auVar118);
      fVar176 = auVar114._0_4_;
      fVar197 = auVar114._4_4_;
      auVar49._4_4_ = fVar197 * auVar119._4_4_;
      auVar49._0_4_ = fVar176 * auVar119._0_4_;
      fVar199 = auVar114._8_4_;
      auVar49._8_4_ = fVar199 * auVar119._8_4_;
      fVar201 = auVar114._12_4_;
      auVar49._12_4_ = fVar201 * auVar119._12_4_;
      fVar203 = auVar114._16_4_;
      auVar49._16_4_ = fVar203 * auVar119._16_4_;
      fVar205 = auVar114._20_4_;
      auVar49._20_4_ = fVar205 * auVar119._20_4_;
      fVar207 = auVar114._24_4_;
      auVar49._24_4_ = fVar207 * auVar119._24_4_;
      auVar49._28_4_ = auVar119._28_4_;
      auVar119 = vfmadd213ps_avx512vl(local_a40,auVar135,auVar118);
      auVar50._4_4_ = fVar197 * auVar119._4_4_;
      auVar50._0_4_ = fVar176 * auVar119._0_4_;
      auVar50._8_4_ = fVar199 * auVar119._8_4_;
      auVar50._12_4_ = fVar201 * auVar119._12_4_;
      auVar50._16_4_ = fVar203 * auVar119._16_4_;
      auVar50._20_4_ = fVar205 * auVar119._20_4_;
      auVar50._24_4_ = fVar207 * auVar119._24_4_;
      auVar50._28_4_ = auVar144._28_4_;
      auVar119 = vminps_avx512vl(auVar49,auVar133);
      auVar120 = ZEXT832(0) << 0x20;
      auVar119 = vmaxps_avx(auVar119,ZEXT832(0) << 0x20);
      auVar121 = vminps_avx512vl(auVar50,auVar133);
      auVar51._4_4_ = (auVar119._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar119._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar119._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar119._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar119._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar119._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar119._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar119._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar51,auVar264,auVar246);
      auVar119 = vmaxps_avx(auVar121,ZEXT832(0) << 0x20);
      auVar52._4_4_ = (auVar119._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar119._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar119._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar119._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar119._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar119._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar119._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar119._28_4_ + 7.0;
      local_500 = vfmadd213ps_avx512vl(auVar52,auVar264,auVar246);
      auVar53._4_4_ = auVar112._4_4_ * auVar112._4_4_;
      auVar53._0_4_ = auVar112._0_4_ * auVar112._0_4_;
      auVar53._8_4_ = auVar112._8_4_ * auVar112._8_4_;
      auVar53._12_4_ = auVar112._12_4_ * auVar112._12_4_;
      auVar53._16_4_ = auVar112._16_4_ * auVar112._16_4_;
      auVar53._20_4_ = auVar112._20_4_ * auVar112._20_4_;
      auVar53._24_4_ = auVar112._24_4_ * auVar112._24_4_;
      auVar53._28_4_ = auVar112._28_4_;
      auVar119 = vsubps_avx(auVar134,auVar53);
      auVar134._4_4_ = auVar119._4_4_ * (float)local_7e0._4_4_;
      auVar134._0_4_ = auVar119._0_4_ * (float)local_7e0._0_4_;
      auVar134._8_4_ = auVar119._8_4_ * fStack_7d8;
      auVar134._12_4_ = auVar119._12_4_ * fStack_7d4;
      auVar134._16_4_ = auVar119._16_4_ * fStack_7d0;
      auVar134._20_4_ = auVar119._20_4_ * fStack_7cc;
      auVar134._24_4_ = auVar119._24_4_ * fStack_7c8;
      auVar134._28_4_ = auVar112._28_4_;
      auVar112 = vsubps_avx(local_7c0,auVar134);
      uVar30 = vcmpps_avx512vl(auVar112,ZEXT832(0) << 0x20,5);
      bVar76 = (byte)uVar30;
      auVar287 = ZEXT3264(local_b00);
      if (bVar76 == 0) {
        bVar76 = 0;
        auVar114 = ZEXT832(0) << 0x20;
        auVar174 = ZEXT864(0) << 0x20;
        auVar112 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar121 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar280 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar135._8_4_ = 0x7f800000;
        auVar135._0_8_ = 0x7f8000007f800000;
        auVar135._12_4_ = 0x7f800000;
        auVar135._16_4_ = 0x7f800000;
        auVar135._20_4_ = 0x7f800000;
        auVar135._24_4_ = 0x7f800000;
        auVar135._28_4_ = 0x7f800000;
        auVar136._8_4_ = 0xff800000;
        auVar136._0_8_ = 0xff800000ff800000;
        auVar136._12_4_ = 0xff800000;
        auVar136._16_4_ = 0xff800000;
        auVar136._20_4_ = 0xff800000;
        auVar136._24_4_ = 0xff800000;
        auVar136._28_4_ = 0xff800000;
      }
      else {
        auVar95 = vxorps_avx512vl(auVar140._0_16_,auVar140._0_16_);
        uVar85 = vcmpps_avx512vl(auVar112,auVar127,5);
        auVar112 = vsqrtps_avx(auVar112);
        auVar120 = vfnmadd213ps_avx512vl(auVar137,local_860,auVar133);
        auVar122 = vfmadd132ps_avx512vl(auVar120,local_860,local_860);
        auVar120 = vsubps_avx(local_800,auVar112);
        auVar123 = vmulps_avx512vl(auVar120,auVar122);
        auVar112 = vsubps_avx512vl(auVar112,auVar136);
        auVar122 = vmulps_avx512vl(auVar112,auVar122);
        auVar112 = vfmadd213ps_avx512vl(auVar135,auVar123,auVar118);
        auVar137._4_4_ = fVar197 * auVar112._4_4_;
        auVar137._0_4_ = fVar176 * auVar112._0_4_;
        auVar137._8_4_ = fVar199 * auVar112._8_4_;
        auVar137._12_4_ = fVar201 * auVar112._12_4_;
        auVar137._16_4_ = fVar203 * auVar112._16_4_;
        auVar137._20_4_ = fVar205 * auVar112._20_4_;
        auVar137._24_4_ = fVar207 * auVar112._24_4_;
        auVar137._28_4_ = auVar121._28_4_;
        auVar54._4_4_ = (float)local_760._4_4_ * auVar123._4_4_;
        auVar54._0_4_ = (float)local_760._0_4_ * auVar123._0_4_;
        auVar54._8_4_ = fStack_758 * auVar123._8_4_;
        auVar54._12_4_ = fStack_754 * auVar123._12_4_;
        auVar54._16_4_ = fStack_750 * auVar123._16_4_;
        auVar54._20_4_ = fStack_74c * auVar123._20_4_;
        auVar54._24_4_ = fStack_748 * auVar123._24_4_;
        auVar54._28_4_ = auVar112._28_4_;
        auVar120 = vmulps_avx512vl(local_780,auVar123);
        auVar124 = vmulps_avx512vl(local_7a0,auVar123);
        auVar112 = vfmadd213ps_avx512vl(auVar115,auVar137,auVar254);
        auVar112 = vsubps_avx512vl(auVar54,auVar112);
        auVar121 = vfmadd213ps_avx512vl(auVar116,auVar137,auVar125);
        auVar121 = vsubps_avx512vl(auVar120,auVar121);
        auVar94 = vfmadd213ps_fma(auVar137,auVar117,auVar126);
        auVar120 = vsubps_avx(auVar124,ZEXT1632(auVar94));
        auVar280 = auVar120._0_28_;
        auVar118 = vfmadd213ps_avx512vl(auVar135,auVar122,auVar118);
        auVar118 = vmulps_avx512vl(auVar114,auVar118);
        auVar55._4_4_ = (float)local_760._4_4_ * auVar122._4_4_;
        auVar55._0_4_ = (float)local_760._0_4_ * auVar122._0_4_;
        auVar55._8_4_ = fStack_758 * auVar122._8_4_;
        auVar55._12_4_ = fStack_754 * auVar122._12_4_;
        auVar55._16_4_ = fStack_750 * auVar122._16_4_;
        auVar55._20_4_ = fStack_74c * auVar122._20_4_;
        auVar55._24_4_ = fStack_748 * auVar122._24_4_;
        auVar55._28_4_ = auVar124._28_4_;
        auVar114 = vmulps_avx512vl(local_780,auVar122);
        auVar124 = vmulps_avx512vl(local_7a0,auVar122);
        auVar94 = vfmadd213ps_fma(auVar115,auVar118,auVar254);
        auVar120 = vsubps_avx(auVar55,ZEXT1632(auVar94));
        auVar94 = vfmadd213ps_fma(auVar116,auVar118,auVar125);
        auVar114 = vsubps_avx512vl(auVar114,ZEXT1632(auVar94));
        auVar94 = vfmadd213ps_fma(auVar117,auVar118,auVar126);
        auVar115 = vsubps_avx512vl(auVar124,ZEXT1632(auVar94));
        auVar174 = ZEXT3264(auVar115);
        auVar225._8_4_ = 0x7f800000;
        auVar225._0_8_ = 0x7f8000007f800000;
        auVar225._12_4_ = 0x7f800000;
        auVar225._16_4_ = 0x7f800000;
        auVar225._20_4_ = 0x7f800000;
        auVar225._24_4_ = 0x7f800000;
        auVar225._28_4_ = 0x7f800000;
        auVar115 = vblendmps_avx512vl(auVar225,auVar123);
        bVar13 = (bool)((byte)uVar85 & 1);
        auVar135._0_4_ = (uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar93._0_4_;
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar93._4_4_;
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar93._8_4_;
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar93._12_4_;
        iVar1 = (uint)((byte)(uVar85 >> 4) & 1) * auVar115._16_4_;
        auVar135._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar85 >> 5) & 1) * auVar115._20_4_;
        auVar135._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar85 >> 6) & 1) * auVar115._24_4_;
        auVar135._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar85 >> 7) * auVar115._28_4_;
        auVar135._28_4_ = iVar4;
        auVar226._8_4_ = 0xff800000;
        auVar226._0_8_ = 0xff800000ff800000;
        auVar226._12_4_ = 0xff800000;
        auVar226._16_4_ = 0xff800000;
        auVar226._20_4_ = 0xff800000;
        auVar226._24_4_ = 0xff800000;
        auVar226._28_4_ = 0xff800000;
        auVar115 = vblendmps_avx512vl(auVar226,auVar122);
        bVar13 = (bool)((byte)uVar85 & 1);
        auVar136._0_4_ = (uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * -0x800000;
        bVar13 = SUB81(uVar85 >> 7,0);
        auVar136._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * -0x800000;
        auVar254._8_4_ = 0x36000000;
        auVar254._0_8_ = 0x3600000036000000;
        auVar254._12_4_ = 0x36000000;
        auVar254._16_4_ = 0x36000000;
        auVar254._20_4_ = 0x36000000;
        auVar254._24_4_ = 0x36000000;
        auVar254._28_4_ = 0x36000000;
        auVar115 = vmulps_avx512vl(local_820,auVar254);
        uVar74 = vcmpps_avx512vl(auVar115,local_840,0xe);
        uVar85 = uVar85 & uVar74;
        bVar77 = (byte)uVar85;
        if (bVar77 != 0) {
          uVar74 = vcmpps_avx512vl(auVar119,ZEXT1632(auVar95),2);
          auVar277._8_4_ = 0x7f800000;
          auVar277._0_8_ = 0x7f8000007f800000;
          auVar277._12_4_ = 0x7f800000;
          auVar277._16_4_ = 0x7f800000;
          auVar277._20_4_ = 0x7f800000;
          auVar277._24_4_ = 0x7f800000;
          auVar277._28_4_ = 0x7f800000;
          auVar281._8_4_ = 0xff800000;
          auVar281._0_8_ = 0xff800000ff800000;
          auVar281._12_4_ = 0xff800000;
          auVar281._16_4_ = 0xff800000;
          auVar281._20_4_ = 0xff800000;
          auVar281._24_4_ = 0xff800000;
          auVar281._28_4_ = 0xff800000;
          auVar116 = vblendmps_avx512vl(auVar277,auVar281);
          bVar81 = (byte)uVar74;
          uVar86 = (uint)(bVar81 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar115._0_4_;
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          uVar151 = (uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar115._4_4_;
          bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
          uVar152 = (uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar115._8_4_;
          bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
          uVar153 = (uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar115._12_4_;
          bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
          uVar154 = (uint)bVar13 * auVar116._16_4_ | (uint)!bVar13 * auVar115._16_4_;
          bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
          uVar155 = (uint)bVar13 * auVar116._20_4_ | (uint)!bVar13 * auVar115._20_4_;
          bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
          uVar156 = (uint)bVar13 * auVar116._24_4_ | (uint)!bVar13 * auVar115._24_4_;
          bVar13 = SUB81(uVar74 >> 7,0);
          uVar157 = (uint)bVar13 * auVar116._28_4_ | (uint)!bVar13 * auVar115._28_4_;
          auVar135._0_4_ = (bVar77 & 1) * uVar86 | !(bool)(bVar77 & 1) * auVar135._0_4_;
          bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar135._4_4_ = bVar13 * uVar151 | !bVar13 * auVar135._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar135._8_4_ = bVar13 * uVar152 | !bVar13 * auVar135._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar135._12_4_ = bVar13 * uVar153 | !bVar13 * auVar135._12_4_;
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar135._16_4_ = bVar13 * uVar154 | (uint)!bVar13 * iVar1;
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar135._20_4_ = bVar13 * uVar155 | (uint)!bVar13 * iVar2;
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar135._24_4_ = bVar13 * uVar156 | (uint)!bVar13 * iVar3;
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar135._28_4_ = bVar13 * uVar157 | (uint)!bVar13 * iVar4;
          auVar115 = vblendmps_avx512vl(auVar281,auVar277);
          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar74 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar74 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar74 >> 6) & 1);
          bVar20 = SUB81(uVar74 >> 7,0);
          auVar136._0_4_ =
               (uint)(bVar77 & 1) *
               ((uint)(bVar81 & 1) * auVar115._0_4_ | !(bool)(bVar81 & 1) * uVar86) |
               !(bool)(bVar77 & 1) * auVar136._0_4_;
          bVar14 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar136._4_4_ =
               (uint)bVar14 * ((uint)bVar13 * auVar115._4_4_ | !bVar13 * uVar151) |
               !bVar14 * auVar136._4_4_;
          bVar13 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar136._8_4_ =
               (uint)bVar13 * ((uint)bVar15 * auVar115._8_4_ | !bVar15 * uVar152) |
               !bVar13 * auVar136._8_4_;
          bVar13 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar136._12_4_ =
               (uint)bVar13 * ((uint)bVar16 * auVar115._12_4_ | !bVar16 * uVar153) |
               !bVar13 * auVar136._12_4_;
          bVar13 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar136._16_4_ =
               (uint)bVar13 * ((uint)bVar17 * auVar115._16_4_ | !bVar17 * uVar154) |
               !bVar13 * auVar136._16_4_;
          bVar13 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar136._20_4_ =
               (uint)bVar13 * ((uint)bVar18 * auVar115._20_4_ | !bVar18 * uVar155) |
               !bVar13 * auVar136._20_4_;
          bVar13 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar136._24_4_ =
               (uint)bVar13 * ((uint)bVar19 * auVar115._24_4_ | !bVar19 * uVar156) |
               !bVar13 * auVar136._24_4_;
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar136._28_4_ =
               (uint)bVar13 * ((uint)bVar20 * auVar115._28_4_ | !bVar20 * uVar157) |
               !bVar13 * auVar136._28_4_;
          bVar76 = (~bVar77 | bVar81) & bVar76;
        }
      }
      auVar255._0_4_ = local_7a0._0_4_ * auVar174._0_4_;
      auVar255._4_4_ = local_7a0._4_4_ * auVar174._4_4_;
      auVar255._8_4_ = local_7a0._8_4_ * auVar174._8_4_;
      auVar255._12_4_ = local_7a0._12_4_ * auVar174._12_4_;
      auVar255._16_4_ = local_7a0._16_4_ * auVar174._16_4_;
      auVar255._20_4_ = local_7a0._20_4_ * auVar174._20_4_;
      auVar255._28_36_ = auVar174._28_36_;
      auVar255._24_4_ = local_7a0._24_4_ * auVar174._24_4_;
      auVar94 = vfmadd231ps_fma(auVar255._0_32_,local_780,auVar114);
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),_local_760,auVar120);
      _local_540 = _local_920;
      local_520 = vminps_avx(local_600,auVar135);
      auVar271._8_4_ = 0x7fffffff;
      auVar271._0_8_ = 0x7fffffff7fffffff;
      auVar271._12_4_ = 0x7fffffff;
      auVar271._16_4_ = 0x7fffffff;
      auVar271._20_4_ = 0x7fffffff;
      auVar271._24_4_ = 0x7fffffff;
      auVar271._28_4_ = 0x7fffffff;
      auVar114 = vandps_avx(ZEXT1632(auVar94),auVar271);
      auVar115 = vmaxps_avx(_local_920,auVar136);
      auVar228._8_4_ = 0x3e99999a;
      auVar228._0_8_ = 0x3e99999a3e99999a;
      auVar228._12_4_ = 0x3e99999a;
      auVar228._16_4_ = 0x3e99999a;
      auVar228._20_4_ = 0x3e99999a;
      auVar228._24_4_ = 0x3e99999a;
      auVar228._28_4_ = 0x3e99999a;
      uVar30 = vcmpps_avx512vl(auVar114,auVar228,1);
      local_6a0._0_2_ = (short)uVar30;
      uVar30 = vcmpps_avx512vl(_local_920,local_520,2);
      bVar77 = (byte)uVar30 & bVar71;
      uVar31 = vcmpps_avx512vl(auVar115,local_600,2);
      auVar284 = ZEXT3264(local_aa0);
      auVar285 = ZEXT3264(local_ac0);
      auVar286 = ZEXT3264(local_ae0);
      if ((bVar71 & ((byte)uVar31 | (byte)uVar30)) == 0) {
        auVar272 = ZEXT3264(local_880);
        auVar255 = ZEXT3264(local_a00);
      }
      else {
        auVar56._4_4_ = local_7a0._4_4_ * auVar280._4_4_;
        auVar56._0_4_ = local_7a0._0_4_ * auVar280._0_4_;
        auVar56._8_4_ = local_7a0._8_4_ * auVar280._8_4_;
        auVar56._12_4_ = local_7a0._12_4_ * auVar280._12_4_;
        auVar56._16_4_ = local_7a0._16_4_ * auVar280._16_4_;
        auVar56._20_4_ = local_7a0._20_4_ * auVar280._20_4_;
        auVar56._24_4_ = local_7a0._24_4_ * auVar280._24_4_;
        auVar56._28_4_ = 0x3e99999a;
        auVar94 = vfmadd213ps_fma(auVar121,local_780,auVar56);
        auVar94 = vfmadd213ps_fma(auVar112,_local_760,ZEXT1632(auVar94));
        auVar112 = vandps_avx(ZEXT1632(auVar94),auVar271);
        uVar30 = vcmpps_avx512vl(auVar112,auVar228,1);
        bVar81 = (byte)uVar30 | ~bVar76;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar46._8_4_ = 3;
        auVar46._0_8_ = 0x300000003;
        auVar46._12_4_ = 3;
        auVar46._16_4_ = 3;
        auVar46._20_4_ = 3;
        auVar46._24_4_ = 3;
        auVar46._28_4_ = 3;
        auVar112 = vpblendmd_avx512vl(auVar170,auVar46);
        local_5c0._0_4_ = (uint)(bVar81 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar81 & 1) * 2;
        bVar13 = (bool)(bVar81 >> 1 & 1);
        local_5c0._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar81 >> 2 & 1);
        local_5c0._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar81 >> 3 & 1);
        local_5c0._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar81 >> 4 & 1);
        local_5c0._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar81 >> 5 & 1);
        local_5c0._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar81 >> 6 & 1);
        local_5c0._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 2;
        local_5c0._28_4_ = (uint)(bVar81 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar81 >> 7) * 2;
        local_640 = vpbroadcastd_avx512vl();
        uVar30 = vpcmpd_avx512vl(local_640,local_5c0,5);
        bVar81 = (byte)uVar30 & bVar77;
        local_620 = auVar115;
        if (bVar81 == 0) {
          auVar172._4_4_ = uVar87;
          auVar172._0_4_ = uVar87;
          auVar172._8_4_ = uVar87;
          auVar172._12_4_ = uVar87;
          auVar172._16_4_ = uVar87;
          auVar172._20_4_ = uVar87;
          auVar172._24_4_ = uVar87;
          auVar172._28_4_ = uVar87;
        }
        else {
          local_5e0 = auVar115;
          auVar95 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar94 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar96 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar101 = vminps_avx(auVar95,auVar96);
          auVar95 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar96 = vmaxps_avx(auVar94,auVar95);
          auVar211._8_4_ = 0x7fffffff;
          auVar211._0_8_ = 0x7fffffff7fffffff;
          auVar211._12_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar101,auVar211);
          auVar95 = vandps_avx(auVar96,auVar211);
          auVar94 = vmaxps_avx(auVar94,auVar95);
          auVar95 = vmovshdup_avx(auVar94);
          auVar95 = vmaxss_avx(auVar95,auVar94);
          auVar94 = vshufpd_avx(auVar94,auVar94,1);
          auVar94 = vmaxss_avx(auVar94,auVar95);
          fVar175 = auVar94._0_4_ * 1.9073486e-06;
          local_980 = vshufps_avx(auVar96,auVar96,0xff);
          local_680 = (float)local_9e0._0_4_ + (float)local_920._0_4_;
          fStack_67c = (float)local_9e0._4_4_ + (float)local_920._4_4_;
          fStack_678 = fStack_9d8 + fStack_918;
          fStack_674 = fStack_9d4 + fStack_914;
          fStack_670 = fStack_9d0 + fStack_910;
          fStack_66c = fStack_9cc + fStack_90c;
          fStack_668 = fStack_9c8 + fStack_908;
          fStack_664 = fStack_9c4 + fStack_904;
          do {
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar112 = vblendmps_avx512vl(auVar171,_local_920);
            auVar147._0_4_ =
                 (uint)(bVar81 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
            bVar13 = (bool)(bVar81 >> 1 & 1);
            auVar147._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar81 >> 2 & 1);
            auVar147._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar81 >> 3 & 1);
            auVar147._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar81 >> 4 & 1);
            auVar147._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar81 >> 5 & 1);
            auVar147._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
            auVar147._24_4_ =
                 (uint)(bVar81 >> 6) * auVar112._24_4_ | (uint)!(bool)(bVar81 >> 6) * 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar112 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar112 = vminps_avx(auVar147,auVar112);
            auVar114 = vshufpd_avx(auVar112,auVar112,5);
            auVar112 = vminps_avx(auVar112,auVar114);
            auVar114 = vpermpd_avx2(auVar112,0x4e);
            auVar112 = vminps_avx(auVar112,auVar114);
            uVar30 = vcmpps_avx512vl(auVar147,auVar112,0);
            bVar72 = (byte)uVar30 & bVar81;
            bVar73 = bVar81;
            if (bVar72 != 0) {
              bVar73 = bVar72;
            }
            iVar2 = 0;
            for (uVar87 = (uint)bVar73; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar87 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
            fVar196 = auVar91._0_4_;
            auVar94 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
              fVar196 = sqrtf((float)local_a20._0_4_);
              auVar94 = local_a80._0_16_;
            }
            auVar94 = vinsertps_avx(auVar94,ZEXT416(uVar87),0x10);
            auVar174 = ZEXT1664(auVar94);
            lVar82 = 5;
            do {
              uVar177 = auVar174._0_4_;
              auVar164._4_4_ = uVar177;
              auVar164._0_4_ = uVar177;
              auVar164._8_4_ = uVar177;
              auVar164._12_4_ = uVar177;
              auVar95 = vfmadd132ps_fma(auVar164,ZEXT816(0) << 0x40,local_a10);
              auVar96 = auVar174._0_16_;
              auVar94 = vmovshdup_avx(auVar96);
              local_800._0_16_ = auVar94;
              fVar204 = 1.0 - auVar94._0_4_;
              auVar94 = vshufps_avx(auVar96,auVar96,0x55);
              fVar198 = auVar94._0_4_;
              auVar212._0_4_ = local_8e0._0_4_ * fVar198;
              fVar200 = auVar94._4_4_;
              auVar212._4_4_ = local_8e0._4_4_ * fVar200;
              fVar159 = auVar94._8_4_;
              auVar212._8_4_ = local_8e0._8_4_ * fVar159;
              fVar202 = auVar94._12_4_;
              auVar212._12_4_ = local_8e0._12_4_ * fVar202;
              _local_7e0 = ZEXT416((uint)fVar204);
              auVar234._4_4_ = fVar204;
              auVar234._0_4_ = fVar204;
              auVar234._8_4_ = fVar204;
              auVar234._12_4_ = fVar204;
              auVar94 = vfmadd231ps_fma(auVar212,auVar234,local_8a0._0_16_);
              auVar250._0_4_ = local_8c0._0_4_ * fVar198;
              auVar250._4_4_ = local_8c0._4_4_ * fVar200;
              auVar250._8_4_ = local_8c0._8_4_ * fVar159;
              auVar250._12_4_ = local_8c0._12_4_ * fVar202;
              auVar96 = vfmadd231ps_fma(auVar250,auVar234,local_8e0._0_16_);
              auVar260._0_4_ = fVar198 * (float)local_900._0_4_;
              auVar260._4_4_ = fVar200 * (float)local_900._4_4_;
              auVar260._8_4_ = fVar159 * fStack_8f8;
              auVar260._12_4_ = fVar202 * fStack_8f4;
              auVar101 = vfmadd231ps_fma(auVar260,auVar234,local_8c0._0_16_);
              auVar269._0_4_ = fVar198 * auVar96._0_4_;
              auVar269._4_4_ = fVar200 * auVar96._4_4_;
              auVar269._8_4_ = fVar159 * auVar96._8_4_;
              auVar269._12_4_ = fVar202 * auVar96._12_4_;
              auVar94 = vfmadd231ps_fma(auVar269,auVar234,auVar94);
              auVar213._0_4_ = fVar198 * auVar101._0_4_;
              auVar213._4_4_ = fVar200 * auVar101._4_4_;
              auVar213._8_4_ = fVar159 * auVar101._8_4_;
              auVar213._12_4_ = fVar202 * auVar101._12_4_;
              auVar96 = vfmadd231ps_fma(auVar213,auVar234,auVar96);
              auVar251._0_4_ = fVar198 * auVar96._0_4_;
              auVar251._4_4_ = fVar200 * auVar96._4_4_;
              auVar251._8_4_ = fVar159 * auVar96._8_4_;
              auVar251._12_4_ = fVar202 * auVar96._12_4_;
              auVar101 = vfmadd231ps_fma(auVar251,auVar94,auVar234);
              auVar94 = vsubps_avx(auVar96,auVar94);
              auVar35._8_4_ = 0x40400000;
              auVar35._0_8_ = 0x4040000040400000;
              auVar35._12_4_ = 0x40400000;
              auVar96 = vmulps_avx512vl(auVar94,auVar35);
              local_7c0._0_16_ = auVar101;
              auVar95 = vsubps_avx(auVar95,auVar101);
              auVar94 = vdpps_avx(auVar95,auVar95,0x7f);
              local_a80._0_16_ = auVar94;
              local_740 = auVar174;
              if (auVar94._0_4_ < 0.0) {
                auVar272._0_4_ = sqrtf(auVar94._0_4_);
                auVar272._4_60_ = extraout_var;
                auVar94 = auVar272._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
              }
              local_820._0_16_ = vdpps_avx(auVar96,auVar96,0x7f);
              fVar198 = local_820._0_4_;
              auVar214._4_12_ = ZEXT812(0) << 0x20;
              auVar214._0_4_ = fVar198;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar214);
              fVar200 = local_a40._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar214);
              auVar36._8_4_ = 0x80000000;
              auVar36._0_8_ = 0x8000000080000000;
              auVar36._12_4_ = 0x80000000;
              auVar97 = vxorps_avx512vl(local_820._0_16_,auVar36);
              auVar101 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,ZEXT416(0x40000000));
              local_860._0_4_ = auVar101._0_4_;
              local_9c0._0_4_ = auVar94._0_4_;
              if (fVar198 < auVar97._0_4_) {
                fVar159 = sqrtf(fVar198);
                auVar94 = ZEXT416((uint)local_9c0._0_4_);
              }
              else {
                auVar101 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar159 = auVar101._0_4_;
              }
              fVar202 = local_a40._0_4_;
              fVar198 = fVar200 * 1.5 + fVar198 * -0.5 * fVar202 * fVar202 * fVar202;
              auVar165._0_4_ = auVar96._0_4_ * fVar198;
              auVar165._4_4_ = auVar96._4_4_ * fVar198;
              auVar165._8_4_ = auVar96._8_4_ * fVar198;
              auVar165._12_4_ = auVar96._12_4_ * fVar198;
              local_a40._0_16_ = vdpps_avx(auVar95,auVar165,0x7f);
              auVar93 = vaddss_avx512f(auVar94,ZEXT416(0x3f800000));
              auVar166._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar166._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar166._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar166._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar101 = vsubps_avx(local_a80._0_16_,auVar166);
              fVar200 = auVar101._0_4_;
              auVar182._4_12_ = ZEXT812(0) << 0x20;
              auVar182._0_4_ = fVar200;
              auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
              auVar98 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
              auVar99 = vmulss_avx512f(auVar101,ZEXT416(0xbf000000));
              uVar84 = fVar200 == 0.0;
              uVar83 = fVar200 < 0.0;
              if ((bool)uVar83) {
                local_940._0_4_ = fVar159;
                local_960._0_4_ = auVar98._0_4_;
                local_970._4_4_ = fVar198;
                local_970._0_4_ = fVar198;
                fStack_968 = fVar198;
                fStack_964 = fVar198;
                local_950 = auVar97;
                fVar200 = sqrtf(fVar200);
                auVar99 = ZEXT416(auVar99._0_4_);
                auVar98 = ZEXT416((uint)local_960._0_4_);
                auVar94 = ZEXT416((uint)local_9c0._0_4_);
                auVar93 = ZEXT416(auVar93._0_4_);
                auVar97 = local_950;
                fVar198 = (float)local_970._0_4_;
                fVar202 = (float)local_970._4_4_;
                fVar204 = fStack_968;
                fVar206 = fStack_964;
                fVar159 = (float)local_940._0_4_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar200 = auVar101._0_4_;
                fVar202 = fVar198;
                fVar204 = fVar198;
                fVar206 = fVar198;
              }
              auVar284 = ZEXT3264(local_aa0);
              auVar285 = ZEXT3264(local_ac0);
              auVar286 = ZEXT3264(local_ae0);
              auVar287 = ZEXT3264(local_b00);
              auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7e0,local_800._0_16_)
              ;
              auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_800._0_16_,_local_7e0)
              ;
              fVar176 = auVar101._0_4_ * 6.0;
              fVar197 = local_800._0_4_ * 6.0;
              auVar235._0_4_ = fVar197 * (float)local_900._0_4_;
              auVar235._4_4_ = fVar197 * (float)local_900._4_4_;
              auVar235._8_4_ = fVar197 * fStack_8f8;
              auVar235._12_4_ = fVar197 * fStack_8f4;
              auVar215._4_4_ = fVar176;
              auVar215._0_4_ = fVar176;
              auVar215._8_4_ = fVar176;
              auVar215._12_4_ = fVar176;
              auVar101 = vfmadd132ps_fma(auVar215,auVar235,local_8c0._0_16_);
              fVar176 = auVar102._0_4_ * 6.0;
              auVar183._4_4_ = fVar176;
              auVar183._0_4_ = fVar176;
              auVar183._8_4_ = fVar176;
              auVar183._12_4_ = fVar176;
              auVar101 = vfmadd132ps_fma(auVar183,auVar101,local_8e0._0_16_);
              fVar176 = local_7e0._0_4_ * 6.0;
              auVar216._4_4_ = fVar176;
              auVar216._0_4_ = fVar176;
              auVar216._8_4_ = fVar176;
              auVar216._12_4_ = fVar176;
              auVar101 = vfmadd132ps_fma(auVar216,auVar101,local_8a0._0_16_);
              auVar184._0_4_ = auVar101._0_4_ * (float)local_820._0_4_;
              auVar184._4_4_ = auVar101._4_4_ * (float)local_820._0_4_;
              auVar184._8_4_ = auVar101._8_4_ * (float)local_820._0_4_;
              auVar184._12_4_ = auVar101._12_4_ * (float)local_820._0_4_;
              auVar101 = vdpps_avx(auVar96,auVar101,0x7f);
              fVar176 = auVar101._0_4_;
              auVar217._0_4_ = auVar96._0_4_ * fVar176;
              auVar217._4_4_ = auVar96._4_4_ * fVar176;
              auVar217._8_4_ = auVar96._8_4_ * fVar176;
              auVar217._12_4_ = auVar96._12_4_ * fVar176;
              auVar101 = vsubps_avx(auVar184,auVar217);
              fVar176 = (float)local_860._0_4_ * (float)local_840._0_4_;
              auVar102 = vmaxss_avx(ZEXT416((uint)fVar175),
                                    ZEXT416((uint)(local_740._0_4_ * fVar196 * 1.9073486e-06)));
              auVar37._8_4_ = 0x80000000;
              auVar37._0_8_ = 0x8000000080000000;
              auVar37._12_4_ = 0x80000000;
              auVar100 = vxorps_avx512vl(auVar96,auVar37);
              auVar185._0_4_ = fVar198 * auVar101._0_4_ * fVar176;
              auVar185._4_4_ = fVar202 * auVar101._4_4_ * fVar176;
              auVar185._8_4_ = fVar204 * auVar101._8_4_ * fVar176;
              auVar185._12_4_ = fVar206 * auVar101._12_4_ * fVar176;
              auVar101 = vdpps_avx(auVar100,auVar165,0x7f);
              auVar103 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar175),auVar102);
              auVar94 = vdpps_avx(auVar95,auVar185,0x7f);
              vfmadd213ss_avx512f(auVar93,ZEXT416((uint)(fVar175 / fVar159)),auVar103);
              fVar198 = auVar101._0_4_ + auVar94._0_4_;
              auVar94 = vdpps_avx(local_a10,auVar165,0x7f);
              auVar101 = vdpps_avx(auVar95,auVar100,0x7f);
              auVar93 = vmulss_avx512f(auVar99,auVar97);
              auVar97 = vmulss_avx512f(auVar97,auVar97);
              auVar98 = vaddss_avx512f(auVar98,ZEXT416((uint)(auVar93._0_4_ * auVar97._0_4_)));
              auVar97 = vdpps_avx(auVar95,local_a10,0x7f);
              auVar99 = vfnmadd231ss_avx512f(auVar101,local_a40._0_16_,ZEXT416((uint)fVar198));
              auVar97 = vfnmadd231ss_avx512f(auVar97,local_a40._0_16_,auVar94);
              auVar101 = vpermilps_avx(local_7c0._0_16_,0xff);
              fVar200 = fVar200 - auVar101._0_4_;
              auVar93 = vshufps_avx(auVar96,auVar96,0xff);
              auVar101 = vfmsub213ss_fma(auVar99,auVar98,auVar93);
              auVar275._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
              auVar275._8_4_ = auVar101._8_4_ ^ 0x80000000;
              auVar275._12_4_ = auVar101._12_4_ ^ 0x80000000;
              auVar97 = ZEXT416((uint)(auVar97._0_4_ * auVar98._0_4_));
              auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar101._0_4_)),
                                        ZEXT416((uint)fVar198),auVar97);
              auVar101 = vinsertps_avx(auVar275,auVar97,0x1c);
              auVar261._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
              auVar261._8_4_ = auVar94._8_4_ ^ 0x80000000;
              auVar261._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar97 = vinsertps_avx(ZEXT416((uint)fVar198),auVar261,0x10);
              auVar236._0_4_ = auVar98._0_4_;
              auVar236._4_4_ = auVar236._0_4_;
              auVar236._8_4_ = auVar236._0_4_;
              auVar236._12_4_ = auVar236._0_4_;
              auVar94 = vdivps_avx(auVar101,auVar236);
              auVar101 = vdivps_avx(auVar97,auVar236);
              auVar97 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar237._0_4_ = auVar97._0_4_ * auVar94._0_4_ + fVar200 * auVar101._0_4_;
              auVar237._4_4_ = auVar97._4_4_ * auVar94._4_4_ + fVar200 * auVar101._4_4_;
              auVar237._8_4_ = auVar97._8_4_ * auVar94._8_4_ + fVar200 * auVar101._8_4_;
              auVar237._12_4_ = auVar97._12_4_ * auVar94._12_4_ + fVar200 * auVar101._12_4_;
              auVar94 = vsubps_avx(local_740._0_16_,auVar237);
              auVar174 = ZEXT1664(auVar94);
              auVar38._8_4_ = 0x7fffffff;
              auVar38._0_8_ = 0x7fffffff7fffffff;
              auVar38._12_4_ = 0x7fffffff;
              auVar101 = vandps_avx512vl(local_a40._0_16_,auVar38);
              auVar101 = vucomiss_avx512f(auVar101);
              if (!(bool)uVar83 && !(bool)uVar84) {
                auVar101 = vaddss_avx512f(auVar102,auVar101);
                auVar101 = vfmadd231ss_fma(auVar101,local_980,ZEXT416(0x36000000));
                auVar39._8_4_ = 0x7fffffff;
                auVar39._0_8_ = 0x7fffffff7fffffff;
                auVar39._12_4_ = 0x7fffffff;
                auVar97 = vandps_avx512vl(ZEXT416((uint)fVar200),auVar39);
                if (auVar97._0_4_ < auVar101._0_4_) {
                  fVar196 = auVar94._0_4_ + (float)local_990._0_4_;
                  if ((fVar196 < fVar158) ||
                     (fVar198 = *(float *)(ray + k * 4 + 0x200), fVar198 < fVar196)) break;
                  auVar94 = vmovshdup_avx(auVar94);
                  fVar200 = auVar94._0_4_;
                  if ((fVar200 < 0.0) || (1.0 < fVar200)) break;
                  auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a80._0_4_));
                  fVar159 = auVar94._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar75].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar159 = fVar159 * 1.5 +
                            (float)local_a80._0_4_ * -0.5 * fVar159 * fVar159 * fVar159;
                  auVar238._0_4_ = auVar95._0_4_ * fVar159;
                  auVar238._4_4_ = auVar95._4_4_ * fVar159;
                  auVar238._8_4_ = auVar95._8_4_ * fVar159;
                  auVar238._12_4_ = auVar95._12_4_ * fVar159;
                  auVar101 = vfmadd213ps_fma(auVar93,auVar238,auVar96);
                  auVar94 = vshufps_avx(auVar238,auVar238,0xc9);
                  auVar95 = vshufps_avx(auVar96,auVar96,0xc9);
                  auVar239._0_4_ = auVar238._0_4_ * auVar95._0_4_;
                  auVar239._4_4_ = auVar238._4_4_ * auVar95._4_4_;
                  auVar239._8_4_ = auVar238._8_4_ * auVar95._8_4_;
                  auVar239._12_4_ = auVar238._12_4_ * auVar95._12_4_;
                  auVar96 = vfmsub231ps_fma(auVar239,auVar96,auVar94);
                  auVar94 = vshufps_avx(auVar96,auVar96,0xc9);
                  auVar95 = vshufps_avx(auVar101,auVar101,0xc9);
                  auVar96 = vshufps_avx(auVar96,auVar96,0xd2);
                  auVar186._0_4_ = auVar101._0_4_ * auVar96._0_4_;
                  auVar186._4_4_ = auVar101._4_4_ * auVar96._4_4_;
                  auVar186._8_4_ = auVar101._8_4_ * auVar96._8_4_;
                  auVar186._12_4_ = auVar101._12_4_ * auVar96._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar186,auVar94,auVar95);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar196;
                    uVar177 = vextractps_avx(auVar94,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar177;
                    uVar177 = vextractps_avx(auVar94,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar177;
                    *(int *)(ray + k * 4 + 0x380) = auVar94._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar200;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(int *)(ray + k * 4 + 0x440) = (int)local_a48;
                    *(uint *)(ray + k * 4 + 0x480) = uVar75;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar11 = context->user;
                  auVar255 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar255,auVar174);
                  auVar174 = vpermps_avx512f(auVar255,ZEXT1664(auVar94));
                  auVar255 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar255,ZEXT1664(auVar94));
                  local_380 = vbroadcastss_avx512f(auVar94);
                  local_400[0] = (RTCHitN)auVar174[0];
                  local_400[1] = (RTCHitN)auVar174[1];
                  local_400[2] = (RTCHitN)auVar174[2];
                  local_400[3] = (RTCHitN)auVar174[3];
                  local_400[4] = (RTCHitN)auVar174[4];
                  local_400[5] = (RTCHitN)auVar174[5];
                  local_400[6] = (RTCHitN)auVar174[6];
                  local_400[7] = (RTCHitN)auVar174[7];
                  local_400[8] = (RTCHitN)auVar174[8];
                  local_400[9] = (RTCHitN)auVar174[9];
                  local_400[10] = (RTCHitN)auVar174[10];
                  local_400[0xb] = (RTCHitN)auVar174[0xb];
                  local_400[0xc] = (RTCHitN)auVar174[0xc];
                  local_400[0xd] = (RTCHitN)auVar174[0xd];
                  local_400[0xe] = (RTCHitN)auVar174[0xe];
                  local_400[0xf] = (RTCHitN)auVar174[0xf];
                  local_400[0x10] = (RTCHitN)auVar174[0x10];
                  local_400[0x11] = (RTCHitN)auVar174[0x11];
                  local_400[0x12] = (RTCHitN)auVar174[0x12];
                  local_400[0x13] = (RTCHitN)auVar174[0x13];
                  local_400[0x14] = (RTCHitN)auVar174[0x14];
                  local_400[0x15] = (RTCHitN)auVar174[0x15];
                  local_400[0x16] = (RTCHitN)auVar174[0x16];
                  local_400[0x17] = (RTCHitN)auVar174[0x17];
                  local_400[0x18] = (RTCHitN)auVar174[0x18];
                  local_400[0x19] = (RTCHitN)auVar174[0x19];
                  local_400[0x1a] = (RTCHitN)auVar174[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar174[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar174[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar174[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar174[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar174[0x1f];
                  local_400[0x20] = (RTCHitN)auVar174[0x20];
                  local_400[0x21] = (RTCHitN)auVar174[0x21];
                  local_400[0x22] = (RTCHitN)auVar174[0x22];
                  local_400[0x23] = (RTCHitN)auVar174[0x23];
                  local_400[0x24] = (RTCHitN)auVar174[0x24];
                  local_400[0x25] = (RTCHitN)auVar174[0x25];
                  local_400[0x26] = (RTCHitN)auVar174[0x26];
                  local_400[0x27] = (RTCHitN)auVar174[0x27];
                  local_400[0x28] = (RTCHitN)auVar174[0x28];
                  local_400[0x29] = (RTCHitN)auVar174[0x29];
                  local_400[0x2a] = (RTCHitN)auVar174[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar174[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar174[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar174[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar174[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar174[0x2f];
                  local_400[0x30] = (RTCHitN)auVar174[0x30];
                  local_400[0x31] = (RTCHitN)auVar174[0x31];
                  local_400[0x32] = (RTCHitN)auVar174[0x32];
                  local_400[0x33] = (RTCHitN)auVar174[0x33];
                  local_400[0x34] = (RTCHitN)auVar174[0x34];
                  local_400[0x35] = (RTCHitN)auVar174[0x35];
                  local_400[0x36] = (RTCHitN)auVar174[0x36];
                  local_400[0x37] = (RTCHitN)auVar174[0x37];
                  local_400[0x38] = (RTCHitN)auVar174[0x38];
                  local_400[0x39] = (RTCHitN)auVar174[0x39];
                  local_400[0x3a] = (RTCHitN)auVar174[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar174[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar174[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar174[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar174[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar174[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar174 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar174);
                  auVar112 = vpcmpeqd_avx2(auVar174._0_32_,auVar174._0_32_);
                  local_a50[3] = auVar112;
                  local_a50[2] = auVar112;
                  local_a50[1] = auVar112;
                  *local_a50 = auVar112;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar11->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar11->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar196;
                  auVar174 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar174);
                  local_b30.valid = (int *)local_700;
                  local_b30.geometryUserPtr = pGVar7->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_400;
                  local_b30.N = 0x10;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_b30);
                    auVar287 = ZEXT3264(local_b00);
                    auVar286 = ZEXT3264(local_ae0);
                    auVar285 = ZEXT3264(local_ac0);
                    auVar284 = ZEXT3264(local_aa0);
                    auVar174 = vmovdqa64_avx512f(local_700);
                  }
                  uVar30 = vptestmd_avx512f(auVar174,auVar174);
                  if ((short)uVar30 != 0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_b30);
                      auVar287 = ZEXT3264(local_b00);
                      auVar286 = ZEXT3264(local_ae0);
                      auVar285 = ZEXT3264(local_ac0);
                      auVar284 = ZEXT3264(local_aa0);
                      auVar174 = vmovdqa64_avx512f(local_700);
                    }
                    uVar85 = vptestmd_avx512f(auVar174,auVar174);
                    if ((short)uVar85 != 0) {
                      iVar3 = *(int *)(local_b30.hit + 4);
                      iVar4 = *(int *)(local_b30.hit + 8);
                      iVar1 = *(int *)(local_b30.hit + 0xc);
                      iVar57 = *(int *)(local_b30.hit + 0x10);
                      iVar58 = *(int *)(local_b30.hit + 0x14);
                      iVar59 = *(int *)(local_b30.hit + 0x18);
                      iVar60 = *(int *)(local_b30.hit + 0x1c);
                      iVar61 = *(int *)(local_b30.hit + 0x20);
                      iVar62 = *(int *)(local_b30.hit + 0x24);
                      iVar63 = *(int *)(local_b30.hit + 0x28);
                      iVar64 = *(int *)(local_b30.hit + 0x2c);
                      iVar65 = *(int *)(local_b30.hit + 0x30);
                      iVar66 = *(int *)(local_b30.hit + 0x34);
                      iVar67 = *(int *)(local_b30.hit + 0x38);
                      iVar68 = *(int *)(local_b30.hit + 0x3c);
                      bVar73 = (byte)uVar85;
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar72 = (byte)(uVar85 >> 8);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x300) =
                           (uint)(bVar73 & 1) * *(int *)local_b30.hit |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x300);
                      *(uint *)(local_b30.ray + 0x304) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x304);
                      *(uint *)(local_b30.ray + 0x308) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x308);
                      *(uint *)(local_b30.ray + 0x30c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x30c);
                      *(uint *)(local_b30.ray + 0x310) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x310);
                      *(uint *)(local_b30.ray + 0x314) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x314);
                      *(uint *)(local_b30.ray + 0x318) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x318);
                      *(uint *)(local_b30.ray + 0x31c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x31c);
                      *(uint *)(local_b30.ray + 800) =
                           (uint)(bVar72 & 1) * iVar61 |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_b30.ray + 800);
                      *(uint *)(local_b30.ray + 0x324) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x324);
                      *(uint *)(local_b30.ray + 0x328) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x328);
                      *(uint *)(local_b30.ray + 0x32c) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x32c);
                      *(uint *)(local_b30.ray + 0x330) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x330);
                      *(uint *)(local_b30.ray + 0x334) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x334);
                      *(uint *)(local_b30.ray + 0x338) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x338);
                      *(uint *)(local_b30.ray + 0x33c) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x33c);
                      iVar3 = *(int *)(local_b30.hit + 0x44);
                      iVar4 = *(int *)(local_b30.hit + 0x48);
                      iVar1 = *(int *)(local_b30.hit + 0x4c);
                      iVar57 = *(int *)(local_b30.hit + 0x50);
                      iVar58 = *(int *)(local_b30.hit + 0x54);
                      iVar59 = *(int *)(local_b30.hit + 0x58);
                      iVar60 = *(int *)(local_b30.hit + 0x5c);
                      iVar61 = *(int *)(local_b30.hit + 0x60);
                      iVar62 = *(int *)(local_b30.hit + 100);
                      iVar63 = *(int *)(local_b30.hit + 0x68);
                      iVar64 = *(int *)(local_b30.hit + 0x6c);
                      iVar65 = *(int *)(local_b30.hit + 0x70);
                      iVar66 = *(int *)(local_b30.hit + 0x74);
                      iVar67 = *(int *)(local_b30.hit + 0x78);
                      iVar68 = *(int *)(local_b30.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x340) =
                           (uint)(bVar73 & 1) * *(int *)(local_b30.hit + 0x40) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x340);
                      *(uint *)(local_b30.ray + 0x344) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x344);
                      *(uint *)(local_b30.ray + 0x348) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x348);
                      *(uint *)(local_b30.ray + 0x34c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x34c);
                      *(uint *)(local_b30.ray + 0x350) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x350);
                      *(uint *)(local_b30.ray + 0x354) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x354);
                      *(uint *)(local_b30.ray + 0x358) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x358);
                      *(uint *)(local_b30.ray + 0x35c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x35c);
                      *(uint *)(local_b30.ray + 0x360) =
                           (uint)(bVar72 & 1) * iVar61 |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_b30.ray + 0x360);
                      *(uint *)(local_b30.ray + 0x364) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x364);
                      *(uint *)(local_b30.ray + 0x368) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x368);
                      *(uint *)(local_b30.ray + 0x36c) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x36c);
                      *(uint *)(local_b30.ray + 0x370) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x370);
                      *(uint *)(local_b30.ray + 0x374) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x374);
                      *(uint *)(local_b30.ray + 0x378) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x378);
                      *(uint *)(local_b30.ray + 0x37c) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x37c);
                      iVar3 = *(int *)(local_b30.hit + 0x84);
                      iVar4 = *(int *)(local_b30.hit + 0x88);
                      iVar1 = *(int *)(local_b30.hit + 0x8c);
                      iVar57 = *(int *)(local_b30.hit + 0x90);
                      iVar58 = *(int *)(local_b30.hit + 0x94);
                      iVar59 = *(int *)(local_b30.hit + 0x98);
                      iVar60 = *(int *)(local_b30.hit + 0x9c);
                      iVar61 = *(int *)(local_b30.hit + 0xa0);
                      iVar62 = *(int *)(local_b30.hit + 0xa4);
                      iVar63 = *(int *)(local_b30.hit + 0xa8);
                      iVar64 = *(int *)(local_b30.hit + 0xac);
                      iVar65 = *(int *)(local_b30.hit + 0xb0);
                      iVar66 = *(int *)(local_b30.hit + 0xb4);
                      iVar67 = *(int *)(local_b30.hit + 0xb8);
                      iVar68 = *(int *)(local_b30.hit + 0xbc);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x380) =
                           (uint)(bVar73 & 1) * *(int *)(local_b30.hit + 0x80) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x380);
                      *(uint *)(local_b30.ray + 900) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 900);
                      *(uint *)(local_b30.ray + 0x388) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x388);
                      *(uint *)(local_b30.ray + 0x38c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x38c);
                      *(uint *)(local_b30.ray + 0x390) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x390);
                      *(uint *)(local_b30.ray + 0x394) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x394);
                      *(uint *)(local_b30.ray + 0x398) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x398);
                      *(uint *)(local_b30.ray + 0x39c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x39c);
                      *(uint *)(local_b30.ray + 0x3a0) =
                           (uint)(bVar72 & 1) * iVar61 |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_b30.ray + 0x3a0);
                      *(uint *)(local_b30.ray + 0x3a4) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3a4);
                      *(uint *)(local_b30.ray + 0x3a8) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3a8);
                      *(uint *)(local_b30.ray + 0x3ac) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ac);
                      *(uint *)(local_b30.ray + 0x3b0) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3b0);
                      *(uint *)(local_b30.ray + 0x3b4) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3b4);
                      *(uint *)(local_b30.ray + 0x3b8) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3b8);
                      *(uint *)(local_b30.ray + 0x3bc) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3bc);
                      iVar3 = *(int *)(local_b30.hit + 0xc4);
                      iVar4 = *(int *)(local_b30.hit + 200);
                      iVar1 = *(int *)(local_b30.hit + 0xcc);
                      iVar57 = *(int *)(local_b30.hit + 0xd0);
                      iVar58 = *(int *)(local_b30.hit + 0xd4);
                      iVar59 = *(int *)(local_b30.hit + 0xd8);
                      iVar60 = *(int *)(local_b30.hit + 0xdc);
                      iVar61 = *(int *)(local_b30.hit + 0xe0);
                      iVar62 = *(int *)(local_b30.hit + 0xe4);
                      iVar63 = *(int *)(local_b30.hit + 0xe8);
                      iVar64 = *(int *)(local_b30.hit + 0xec);
                      iVar65 = *(int *)(local_b30.hit + 0xf0);
                      iVar66 = *(int *)(local_b30.hit + 0xf4);
                      iVar67 = *(int *)(local_b30.hit + 0xf8);
                      iVar68 = *(int *)(local_b30.hit + 0xfc);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x3c0) =
                           (uint)(bVar73 & 1) * *(int *)(local_b30.hit + 0xc0) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x3c0);
                      *(uint *)(local_b30.ray + 0x3c4) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x3c4);
                      *(uint *)(local_b30.ray + 0x3c8) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3c8);
                      *(uint *)(local_b30.ray + 0x3cc) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3cc);
                      *(uint *)(local_b30.ray + 0x3d0) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3d0);
                      *(uint *)(local_b30.ray + 0x3d4) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3d4);
                      *(uint *)(local_b30.ray + 0x3d8) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3d8);
                      *(uint *)(local_b30.ray + 0x3dc) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3dc);
                      *(uint *)(local_b30.ray + 0x3e0) =
                           (uint)(bVar72 & 1) * iVar61 |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_b30.ray + 0x3e0);
                      *(uint *)(local_b30.ray + 0x3e4) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3e4);
                      *(uint *)(local_b30.ray + 1000) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 1000);
                      *(uint *)(local_b30.ray + 0x3ec) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ec);
                      *(uint *)(local_b30.ray + 0x3f0) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3f0);
                      *(uint *)(local_b30.ray + 0x3f4) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3f4);
                      *(uint *)(local_b30.ray + 0x3f8) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3f8);
                      *(uint *)(local_b30.ray + 0x3fc) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3fc);
                      iVar3 = *(int *)(local_b30.hit + 0x104);
                      iVar4 = *(int *)(local_b30.hit + 0x108);
                      iVar1 = *(int *)(local_b30.hit + 0x10c);
                      iVar57 = *(int *)(local_b30.hit + 0x110);
                      iVar58 = *(int *)(local_b30.hit + 0x114);
                      iVar59 = *(int *)(local_b30.hit + 0x118);
                      iVar60 = *(int *)(local_b30.hit + 0x11c);
                      iVar61 = *(int *)(local_b30.hit + 0x120);
                      iVar62 = *(int *)(local_b30.hit + 0x124);
                      iVar63 = *(int *)(local_b30.hit + 0x128);
                      iVar64 = *(int *)(local_b30.hit + 300);
                      iVar65 = *(int *)(local_b30.hit + 0x130);
                      iVar66 = *(int *)(local_b30.hit + 0x134);
                      iVar67 = *(int *)(local_b30.hit + 0x138);
                      iVar68 = *(int *)(local_b30.hit + 0x13c);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x400) =
                           (uint)(bVar73 & 1) * *(int *)(local_b30.hit + 0x100) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x400);
                      *(uint *)(local_b30.ray + 0x404) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x404);
                      *(uint *)(local_b30.ray + 0x408) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x408);
                      *(uint *)(local_b30.ray + 0x40c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x40c);
                      *(uint *)(local_b30.ray + 0x410) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x410);
                      *(uint *)(local_b30.ray + 0x414) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x414);
                      *(uint *)(local_b30.ray + 0x418) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x418);
                      *(uint *)(local_b30.ray + 0x41c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x41c);
                      *(uint *)(local_b30.ray + 0x420) =
                           (uint)(bVar72 & 1) * iVar61 |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_b30.ray + 0x420);
                      *(uint *)(local_b30.ray + 0x424) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x424);
                      *(uint *)(local_b30.ray + 0x428) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x428);
                      *(uint *)(local_b30.ray + 0x42c) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x42c);
                      *(uint *)(local_b30.ray + 0x430) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x430);
                      *(uint *)(local_b30.ray + 0x434) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x434);
                      *(uint *)(local_b30.ray + 0x438) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x438);
                      *(uint *)(local_b30.ray + 0x43c) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x43c);
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar174;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar198;
                  break;
                }
              }
              lVar82 = lVar82 + -1;
            } while (lVar82 != 0);
            uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar172._4_4_ = uVar177;
            auVar172._0_4_ = uVar177;
            auVar172._8_4_ = uVar177;
            auVar172._12_4_ = uVar177;
            auVar172._16_4_ = uVar177;
            auVar172._20_4_ = uVar177;
            auVar172._24_4_ = uVar177;
            auVar172._28_4_ = uVar177;
            auVar69._4_4_ = fStack_67c;
            auVar69._0_4_ = local_680;
            auVar69._8_4_ = fStack_678;
            auVar69._12_4_ = fStack_674;
            auVar69._16_4_ = fStack_670;
            auVar69._20_4_ = fStack_66c;
            auVar69._24_4_ = fStack_668;
            auVar69._28_4_ = fStack_664;
            uVar30 = vcmpps_avx512vl(auVar172,auVar69,0xd);
            bVar81 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar81 & (byte)uVar30;
          } while (bVar81 != 0);
          auVar115 = local_5e0;
        }
        bVar76 = local_6a0[0] | ~bVar76;
        auVar194._0_4_ = (float)local_9e0._0_4_ + auVar115._0_4_;
        auVar194._4_4_ = (float)local_9e0._4_4_ + auVar115._4_4_;
        auVar194._8_4_ = fStack_9d8 + auVar115._8_4_;
        auVar194._12_4_ = fStack_9d4 + auVar115._12_4_;
        auVar194._16_4_ = fStack_9d0 + auVar115._16_4_;
        auVar194._20_4_ = fStack_9cc + auVar115._20_4_;
        auVar194._24_4_ = fStack_9c8 + auVar115._24_4_;
        auVar194._28_4_ = fStack_9c4 + auVar115._28_4_;
        uVar30 = vcmpps_avx512vl(auVar194,auVar172,2);
        bVar71 = (byte)uVar31 & bVar71 & (byte)uVar30;
        auVar195._8_4_ = 2;
        auVar195._0_8_ = 0x200000002;
        auVar195._12_4_ = 2;
        auVar195._16_4_ = 2;
        auVar195._20_4_ = 2;
        auVar195._24_4_ = 2;
        auVar195._28_4_ = 2;
        auVar47._8_4_ = 3;
        auVar47._0_8_ = 0x300000003;
        auVar47._12_4_ = 3;
        auVar47._16_4_ = 3;
        auVar47._20_4_ = 3;
        auVar47._24_4_ = 3;
        auVar47._28_4_ = 3;
        auVar112 = vpblendmd_avx512vl(auVar195,auVar47);
        auVar148._0_4_ = (uint)(bVar76 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
        bVar13 = (bool)(bVar76 >> 1 & 1);
        auVar148._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar76 >> 2 & 1);
        auVar148._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar76 >> 3 & 1);
        auVar148._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar76 >> 4 & 1);
        auVar148._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar76 >> 5 & 1);
        auVar148._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 2;
        bVar13 = (bool)(bVar76 >> 6 & 1);
        auVar148._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 2;
        auVar148._28_4_ = (uint)(bVar76 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
        uVar30 = vpcmpd_avx512vl(local_640,auVar148,5);
        bVar76 = (byte)uVar30 & bVar71;
        fVar175 = (float)local_9e0._0_4_;
        fVar196 = (float)local_9e0._4_4_;
        fVar198 = fStack_9d8;
        fVar200 = fStack_9d4;
        fVar159 = fStack_9d0;
        fVar202 = fStack_9cc;
        fVar204 = fStack_9c8;
        fVar206 = fStack_9c4;
        if (bVar76 != 0) {
          auVar95 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar94 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar96 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar101 = vminps_avx(auVar95,auVar96);
          auVar95 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar96 = vmaxps_avx(auVar94,auVar95);
          auVar218._8_4_ = 0x7fffffff;
          auVar218._0_8_ = 0x7fffffff7fffffff;
          auVar218._12_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar101,auVar218);
          auVar95 = vandps_avx(auVar96,auVar218);
          auVar94 = vmaxps_avx(auVar94,auVar95);
          auVar95 = vmovshdup_avx(auVar94);
          auVar95 = vmaxss_avx(auVar95,auVar94);
          auVar94 = vshufpd_avx(auVar94,auVar94,1);
          auVar94 = vmaxss_avx(auVar94,auVar95);
          fVar175 = auVar94._0_4_ * 1.9073486e-06;
          local_980 = vshufps_avx(auVar96,auVar96,0xff);
          local_680 = (float)local_9e0._0_4_ + local_620._0_4_;
          fStack_67c = (float)local_9e0._4_4_ + local_620._4_4_;
          fStack_678 = fStack_9d8 + local_620._8_4_;
          fStack_674 = fStack_9d4 + local_620._12_4_;
          fStack_670 = fStack_9d0 + local_620._16_4_;
          fStack_66c = fStack_9cc + local_620._20_4_;
          fStack_668 = fStack_9c8 + local_620._24_4_;
          fStack_664 = fStack_9c4 + local_620._28_4_;
          _local_920 = local_620;
          local_6a0 = auVar148;
          do {
            auVar173._8_4_ = 0x7f800000;
            auVar173._0_8_ = 0x7f8000007f800000;
            auVar173._12_4_ = 0x7f800000;
            auVar173._16_4_ = 0x7f800000;
            auVar173._20_4_ = 0x7f800000;
            auVar173._24_4_ = 0x7f800000;
            auVar173._28_4_ = 0x7f800000;
            auVar112 = vblendmps_avx512vl(auVar173,_local_920);
            auVar149._0_4_ =
                 (uint)(bVar76 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
            bVar13 = (bool)(bVar76 >> 1 & 1);
            auVar149._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar76 >> 2 & 1);
            auVar149._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar76 >> 3 & 1);
            auVar149._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar76 >> 4 & 1);
            auVar149._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
            bVar13 = (bool)(bVar76 >> 5 & 1);
            auVar149._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
            auVar149._24_4_ =
                 (uint)(bVar76 >> 6) * auVar112._24_4_ | (uint)!(bool)(bVar76 >> 6) * 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar112 = vshufps_avx(auVar149,auVar149,0xb1);
            auVar112 = vminps_avx(auVar149,auVar112);
            auVar114 = vshufpd_avx(auVar112,auVar112,5);
            auVar112 = vminps_avx(auVar112,auVar114);
            auVar114 = vpermpd_avx2(auVar112,0x4e);
            auVar112 = vminps_avx(auVar112,auVar114);
            uVar30 = vcmpps_avx512vl(auVar149,auVar112,0);
            bVar73 = (byte)uVar30 & bVar76;
            bVar81 = bVar76;
            if (bVar73 != 0) {
              bVar81 = bVar73;
            }
            iVar2 = 0;
            for (uVar87 = (uint)bVar81; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar87 = *(uint *)(local_500 + (uint)(iVar2 << 2));
            fVar196 = auVar92._0_4_;
            auVar94 = ZEXT416(*(uint *)(local_600 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_600 + (uint)(iVar2 << 2)));
              fVar196 = sqrtf((float)local_a20._0_4_);
              auVar94 = local_a80._0_16_;
            }
            auVar94 = vinsertps_avx(auVar94,ZEXT416(uVar87),0x10);
            auVar174 = ZEXT1664(auVar94);
            lVar82 = 5;
            do {
              uVar177 = auVar174._0_4_;
              auVar167._4_4_ = uVar177;
              auVar167._0_4_ = uVar177;
              auVar167._8_4_ = uVar177;
              auVar167._12_4_ = uVar177;
              auVar95 = vfmadd132ps_fma(auVar167,ZEXT816(0) << 0x40,local_a10);
              auVar96 = auVar174._0_16_;
              auVar94 = vmovshdup_avx(auVar96);
              local_800._0_16_ = auVar94;
              fVar204 = 1.0 - auVar94._0_4_;
              auVar94 = vshufps_avx(auVar96,auVar96,0x55);
              fVar198 = auVar94._0_4_;
              auVar219._0_4_ = local_8e0._0_4_ * fVar198;
              fVar200 = auVar94._4_4_;
              auVar219._4_4_ = local_8e0._4_4_ * fVar200;
              fVar159 = auVar94._8_4_;
              auVar219._8_4_ = local_8e0._8_4_ * fVar159;
              fVar202 = auVar94._12_4_;
              auVar219._12_4_ = local_8e0._12_4_ * fVar202;
              _local_7e0 = ZEXT416((uint)fVar204);
              auVar240._4_4_ = fVar204;
              auVar240._0_4_ = fVar204;
              auVar240._8_4_ = fVar204;
              auVar240._12_4_ = fVar204;
              auVar94 = vfmadd231ps_fma(auVar219,auVar240,local_8a0._0_16_);
              auVar252._0_4_ = local_8c0._0_4_ * fVar198;
              auVar252._4_4_ = local_8c0._4_4_ * fVar200;
              auVar252._8_4_ = local_8c0._8_4_ * fVar159;
              auVar252._12_4_ = local_8c0._12_4_ * fVar202;
              auVar96 = vfmadd231ps_fma(auVar252,auVar240,local_8e0._0_16_);
              auVar262._0_4_ = fVar198 * (float)local_900._0_4_;
              auVar262._4_4_ = fVar200 * (float)local_900._4_4_;
              auVar262._8_4_ = fVar159 * fStack_8f8;
              auVar262._12_4_ = fVar202 * fStack_8f4;
              auVar101 = vfmadd231ps_fma(auVar262,auVar240,local_8c0._0_16_);
              auVar270._0_4_ = fVar198 * auVar96._0_4_;
              auVar270._4_4_ = fVar200 * auVar96._4_4_;
              auVar270._8_4_ = fVar159 * auVar96._8_4_;
              auVar270._12_4_ = fVar202 * auVar96._12_4_;
              auVar94 = vfmadd231ps_fma(auVar270,auVar240,auVar94);
              auVar220._0_4_ = fVar198 * auVar101._0_4_;
              auVar220._4_4_ = fVar200 * auVar101._4_4_;
              auVar220._8_4_ = fVar159 * auVar101._8_4_;
              auVar220._12_4_ = fVar202 * auVar101._12_4_;
              auVar96 = vfmadd231ps_fma(auVar220,auVar240,auVar96);
              auVar253._0_4_ = fVar198 * auVar96._0_4_;
              auVar253._4_4_ = fVar200 * auVar96._4_4_;
              auVar253._8_4_ = fVar159 * auVar96._8_4_;
              auVar253._12_4_ = fVar202 * auVar96._12_4_;
              auVar101 = vfmadd231ps_fma(auVar253,auVar94,auVar240);
              auVar94 = vsubps_avx(auVar96,auVar94);
              auVar40._8_4_ = 0x40400000;
              auVar40._0_8_ = 0x4040000040400000;
              auVar40._12_4_ = 0x40400000;
              auVar96 = vmulps_avx512vl(auVar94,auVar40);
              local_7c0._0_16_ = auVar101;
              auVar95 = vsubps_avx(auVar95,auVar101);
              auVar94 = vdpps_avx(auVar95,auVar95,0x7f);
              local_a80._0_16_ = auVar94;
              local_740 = auVar174;
              if (auVar94._0_4_ < 0.0) {
                auVar284._0_4_ = sqrtf(auVar94._0_4_);
                auVar284._4_60_ = extraout_var_00;
                auVar94 = auVar284._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
              }
              local_820._0_16_ = vdpps_avx(auVar96,auVar96,0x7f);
              fVar198 = local_820._0_4_;
              auVar221._4_12_ = ZEXT812(0) << 0x20;
              auVar221._0_4_ = fVar198;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar221);
              fVar200 = local_a40._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar221);
              auVar41._8_4_ = 0x80000000;
              auVar41._0_8_ = 0x8000000080000000;
              auVar41._12_4_ = 0x80000000;
              auVar97 = vxorps_avx512vl(local_820._0_16_,auVar41);
              auVar101 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,ZEXT416(0x40000000));
              local_860._0_4_ = auVar101._0_4_;
              local_9c0._0_4_ = auVar94._0_4_;
              if (fVar198 < auVar97._0_4_) {
                fVar159 = sqrtf(fVar198);
                auVar94 = ZEXT416((uint)local_9c0._0_4_);
              }
              else {
                auVar101 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar159 = auVar101._0_4_;
              }
              fVar202 = local_a40._0_4_;
              auVar93 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar200 * 1.5 +
                                                 fVar198 * -0.5 * fVar202 * fVar202 * fVar202)));
              auVar97 = vmulps_avx512vl(auVar96,auVar93);
              local_a40._0_16_ = vdpps_avx(auVar95,auVar97,0x7f);
              auVar99 = vaddss_avx512f(auVar94,ZEXT416(0x3f800000));
              auVar168._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar168._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar168._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar168._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar101 = vsubps_avx(local_a80._0_16_,auVar168);
              fVar198 = auVar101._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar198;
              auVar98 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar102 = vmulss_avx512f(auVar98,ZEXT416(0x3fc00000));
              auVar103 = vmulss_avx512f(auVar101,ZEXT416(0xbf000000));
              uVar84 = fVar198 == 0.0;
              uVar83 = fVar198 < 0.0;
              if ((bool)uVar83) {
                local_950._0_4_ = auVar102._0_4_;
                _local_970 = auVar93;
                local_960 = auVar97;
                local_940 = auVar98;
                fVar198 = sqrtf(fVar198);
                auVar103 = ZEXT416(auVar103._0_4_);
                auVar102 = ZEXT416((uint)local_950._0_4_);
                auVar94 = ZEXT416((uint)local_9c0._0_4_);
                auVar99 = ZEXT416(auVar99._0_4_);
                auVar97 = local_960;
                auVar98 = local_940;
                auVar93 = _local_970;
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar198 = auVar101._0_4_;
              }
              in_ZMM31 = ZEXT1664(auVar93);
              auVar284 = ZEXT3264(local_aa0);
              auVar285 = ZEXT3264(local_ac0);
              auVar286 = ZEXT3264(local_ae0);
              auVar287 = ZEXT3264(local_b00);
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7e0,local_800._0_16_)
              ;
              auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_800._0_16_,_local_7e0)
              ;
              fVar200 = auVar101._0_4_ * 6.0;
              fVar202 = local_800._0_4_ * 6.0;
              auVar241._0_4_ = fVar202 * (float)local_900._0_4_;
              auVar241._4_4_ = fVar202 * (float)local_900._4_4_;
              auVar241._8_4_ = fVar202 * fStack_8f8;
              auVar241._12_4_ = fVar202 * fStack_8f4;
              auVar222._4_4_ = fVar200;
              auVar222._0_4_ = fVar200;
              auVar222._8_4_ = fVar200;
              auVar222._12_4_ = fVar200;
              auVar101 = vfmadd132ps_fma(auVar222,auVar241,local_8c0._0_16_);
              fVar200 = auVar100._0_4_ * 6.0;
              auVar188._4_4_ = fVar200;
              auVar188._0_4_ = fVar200;
              auVar188._8_4_ = fVar200;
              auVar188._12_4_ = fVar200;
              auVar101 = vfmadd132ps_fma(auVar188,auVar101,local_8e0._0_16_);
              fVar200 = local_7e0._0_4_ * 6.0;
              auVar223._4_4_ = fVar200;
              auVar223._0_4_ = fVar200;
              auVar223._8_4_ = fVar200;
              auVar223._12_4_ = fVar200;
              auVar101 = vfmadd132ps_fma(auVar223,auVar101,local_8a0._0_16_);
              auVar189._0_4_ = auVar101._0_4_ * (float)local_820._0_4_;
              auVar189._4_4_ = auVar101._4_4_ * (float)local_820._0_4_;
              auVar189._8_4_ = auVar101._8_4_ * (float)local_820._0_4_;
              auVar189._12_4_ = auVar101._12_4_ * (float)local_820._0_4_;
              auVar101 = vdpps_avx(auVar96,auVar101,0x7f);
              fVar200 = auVar101._0_4_;
              auVar224._0_4_ = auVar96._0_4_ * fVar200;
              auVar224._4_4_ = auVar96._4_4_ * fVar200;
              auVar224._8_4_ = auVar96._8_4_ * fVar200;
              auVar224._12_4_ = auVar96._12_4_ * fVar200;
              auVar101 = vsubps_avx(auVar189,auVar224);
              fVar200 = (float)local_860._0_4_ * (float)local_840._0_4_;
              auVar100 = vmaxss_avx(ZEXT416((uint)fVar175),
                                    ZEXT416((uint)(local_740._0_4_ * fVar196 * 1.9073486e-06)));
              auVar190._0_4_ = auVar101._0_4_ * fVar200;
              auVar190._4_4_ = auVar101._4_4_ * fVar200;
              auVar190._8_4_ = auVar101._8_4_ * fVar200;
              auVar190._12_4_ = auVar101._12_4_ * fVar200;
              auVar42._8_4_ = 0x80000000;
              auVar42._0_8_ = 0x8000000080000000;
              auVar42._12_4_ = 0x80000000;
              auVar104 = vxorps_avx512vl(auVar96,auVar42);
              auVar105 = vmulps_avx512vl(auVar93,auVar190);
              auVar101 = vdpps_avx(auVar104,auVar97,0x7f);
              auVar93 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar175),auVar100);
              auVar94 = vdpps_avx(auVar95,auVar105,0x7f);
              vfmadd213ss_avx512f(auVar99,ZEXT416((uint)(fVar175 / fVar159)),auVar93);
              fVar200 = auVar101._0_4_ + auVar94._0_4_;
              auVar94 = vdpps_avx(local_a10,auVar97,0x7f);
              auVar101 = vdpps_avx(auVar95,auVar104,0x7f);
              auVar97 = vmulss_avx512f(auVar103,auVar98);
              auVar93 = vmulss_avx512f(auVar98,auVar98);
              auVar98 = vaddss_avx512f(auVar102,ZEXT416((uint)(auVar97._0_4_ * auVar93._0_4_)));
              auVar97 = vdpps_avx(auVar95,local_a10,0x7f);
              auVar99 = vfnmadd231ss_avx512f(auVar101,local_a40._0_16_,ZEXT416((uint)fVar200));
              auVar97 = vfnmadd231ss_avx512f(auVar97,local_a40._0_16_,auVar94);
              auVar101 = vpermilps_avx(local_7c0._0_16_,0xff);
              fVar198 = fVar198 - auVar101._0_4_;
              auVar93 = vshufps_avx(auVar96,auVar96,0xff);
              auVar101 = vfmsub213ss_fma(auVar99,auVar98,auVar93);
              auVar276._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
              auVar276._8_4_ = auVar101._8_4_ ^ 0x80000000;
              auVar276._12_4_ = auVar101._12_4_ ^ 0x80000000;
              auVar97 = ZEXT416((uint)(auVar97._0_4_ * auVar98._0_4_));
              auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar101._0_4_)),
                                        ZEXT416((uint)fVar200),auVar97);
              auVar101 = vinsertps_avx(auVar276,auVar97,0x1c);
              auVar263._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
              auVar263._8_4_ = auVar94._8_4_ ^ 0x80000000;
              auVar263._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar97 = vinsertps_avx(ZEXT416((uint)fVar200),auVar263,0x10);
              auVar242._0_4_ = auVar98._0_4_;
              auVar242._4_4_ = auVar242._0_4_;
              auVar242._8_4_ = auVar242._0_4_;
              auVar242._12_4_ = auVar242._0_4_;
              auVar94 = vdivps_avx(auVar101,auVar242);
              auVar101 = vdivps_avx(auVar97,auVar242);
              auVar97 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar243._0_4_ = auVar97._0_4_ * auVar94._0_4_ + fVar198 * auVar101._0_4_;
              auVar243._4_4_ = auVar97._4_4_ * auVar94._4_4_ + fVar198 * auVar101._4_4_;
              auVar243._8_4_ = auVar97._8_4_ * auVar94._8_4_ + fVar198 * auVar101._8_4_;
              auVar243._12_4_ = auVar97._12_4_ * auVar94._12_4_ + fVar198 * auVar101._12_4_;
              auVar94 = vsubps_avx(local_740._0_16_,auVar243);
              auVar174 = ZEXT1664(auVar94);
              auVar43._8_4_ = 0x7fffffff;
              auVar43._0_8_ = 0x7fffffff7fffffff;
              auVar43._12_4_ = 0x7fffffff;
              auVar101 = vandps_avx512vl(local_a40._0_16_,auVar43);
              auVar101 = vucomiss_avx512f(auVar101);
              if (!(bool)uVar83 && !(bool)uVar84) {
                auVar101 = vaddss_avx512f(auVar100,auVar101);
                auVar101 = vfmadd231ss_fma(auVar101,local_980,ZEXT416(0x36000000));
                auVar44._8_4_ = 0x7fffffff;
                auVar44._0_8_ = 0x7fffffff7fffffff;
                auVar44._12_4_ = 0x7fffffff;
                auVar97 = vandps_avx512vl(ZEXT416((uint)fVar198),auVar44);
                if (auVar97._0_4_ < auVar101._0_4_) {
                  fVar196 = auVar94._0_4_ + (float)local_990._0_4_;
                  if ((fVar196 < fVar158) ||
                     (fVar198 = *(float *)(ray + k * 4 + 0x200), fVar198 < fVar196)) break;
                  auVar94 = vmovshdup_avx(auVar94);
                  fVar200 = auVar94._0_4_;
                  if ((fVar200 < 0.0) || (1.0 < fVar200)) break;
                  auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a80._0_4_));
                  fVar159 = auVar94._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar75].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar159 = fVar159 * 1.5 +
                            (float)local_a80._0_4_ * -0.5 * fVar159 * fVar159 * fVar159;
                  auVar244._0_4_ = auVar95._0_4_ * fVar159;
                  auVar244._4_4_ = auVar95._4_4_ * fVar159;
                  auVar244._8_4_ = auVar95._8_4_ * fVar159;
                  auVar244._12_4_ = auVar95._12_4_ * fVar159;
                  auVar101 = vfmadd213ps_fma(auVar93,auVar244,auVar96);
                  auVar94 = vshufps_avx(auVar244,auVar244,0xc9);
                  auVar95 = vshufps_avx(auVar96,auVar96,0xc9);
                  auVar245._0_4_ = auVar244._0_4_ * auVar95._0_4_;
                  auVar245._4_4_ = auVar244._4_4_ * auVar95._4_4_;
                  auVar245._8_4_ = auVar244._8_4_ * auVar95._8_4_;
                  auVar245._12_4_ = auVar244._12_4_ * auVar95._12_4_;
                  auVar96 = vfmsub231ps_fma(auVar245,auVar96,auVar94);
                  auVar94 = vshufps_avx(auVar96,auVar96,0xc9);
                  auVar95 = vshufps_avx(auVar101,auVar101,0xc9);
                  auVar96 = vshufps_avx(auVar96,auVar96,0xd2);
                  auVar191._0_4_ = auVar101._0_4_ * auVar96._0_4_;
                  auVar191._4_4_ = auVar101._4_4_ * auVar96._4_4_;
                  auVar191._8_4_ = auVar101._8_4_ * auVar96._8_4_;
                  auVar191._12_4_ = auVar101._12_4_ * auVar96._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar191,auVar94,auVar95);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar196;
                    uVar177 = vextractps_avx(auVar94,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar177;
                    uVar177 = vextractps_avx(auVar94,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar177;
                    *(int *)(ray + k * 4 + 0x380) = auVar94._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar200;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(int *)(ray + k * 4 + 0x440) = (int)local_a48;
                    *(uint *)(ray + k * 4 + 0x480) = uVar75;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar11 = context->user;
                  auVar255 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar255,auVar174);
                  auVar174 = vpermps_avx512f(auVar255,ZEXT1664(auVar94));
                  auVar255 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar255,ZEXT1664(auVar94));
                  local_380 = vbroadcastss_avx512f(auVar94);
                  local_400[0] = (RTCHitN)auVar174[0];
                  local_400[1] = (RTCHitN)auVar174[1];
                  local_400[2] = (RTCHitN)auVar174[2];
                  local_400[3] = (RTCHitN)auVar174[3];
                  local_400[4] = (RTCHitN)auVar174[4];
                  local_400[5] = (RTCHitN)auVar174[5];
                  local_400[6] = (RTCHitN)auVar174[6];
                  local_400[7] = (RTCHitN)auVar174[7];
                  local_400[8] = (RTCHitN)auVar174[8];
                  local_400[9] = (RTCHitN)auVar174[9];
                  local_400[10] = (RTCHitN)auVar174[10];
                  local_400[0xb] = (RTCHitN)auVar174[0xb];
                  local_400[0xc] = (RTCHitN)auVar174[0xc];
                  local_400[0xd] = (RTCHitN)auVar174[0xd];
                  local_400[0xe] = (RTCHitN)auVar174[0xe];
                  local_400[0xf] = (RTCHitN)auVar174[0xf];
                  local_400[0x10] = (RTCHitN)auVar174[0x10];
                  local_400[0x11] = (RTCHitN)auVar174[0x11];
                  local_400[0x12] = (RTCHitN)auVar174[0x12];
                  local_400[0x13] = (RTCHitN)auVar174[0x13];
                  local_400[0x14] = (RTCHitN)auVar174[0x14];
                  local_400[0x15] = (RTCHitN)auVar174[0x15];
                  local_400[0x16] = (RTCHitN)auVar174[0x16];
                  local_400[0x17] = (RTCHitN)auVar174[0x17];
                  local_400[0x18] = (RTCHitN)auVar174[0x18];
                  local_400[0x19] = (RTCHitN)auVar174[0x19];
                  local_400[0x1a] = (RTCHitN)auVar174[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar174[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar174[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar174[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar174[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar174[0x1f];
                  local_400[0x20] = (RTCHitN)auVar174[0x20];
                  local_400[0x21] = (RTCHitN)auVar174[0x21];
                  local_400[0x22] = (RTCHitN)auVar174[0x22];
                  local_400[0x23] = (RTCHitN)auVar174[0x23];
                  local_400[0x24] = (RTCHitN)auVar174[0x24];
                  local_400[0x25] = (RTCHitN)auVar174[0x25];
                  local_400[0x26] = (RTCHitN)auVar174[0x26];
                  local_400[0x27] = (RTCHitN)auVar174[0x27];
                  local_400[0x28] = (RTCHitN)auVar174[0x28];
                  local_400[0x29] = (RTCHitN)auVar174[0x29];
                  local_400[0x2a] = (RTCHitN)auVar174[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar174[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar174[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar174[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar174[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar174[0x2f];
                  local_400[0x30] = (RTCHitN)auVar174[0x30];
                  local_400[0x31] = (RTCHitN)auVar174[0x31];
                  local_400[0x32] = (RTCHitN)auVar174[0x32];
                  local_400[0x33] = (RTCHitN)auVar174[0x33];
                  local_400[0x34] = (RTCHitN)auVar174[0x34];
                  local_400[0x35] = (RTCHitN)auVar174[0x35];
                  local_400[0x36] = (RTCHitN)auVar174[0x36];
                  local_400[0x37] = (RTCHitN)auVar174[0x37];
                  local_400[0x38] = (RTCHitN)auVar174[0x38];
                  local_400[0x39] = (RTCHitN)auVar174[0x39];
                  local_400[0x3a] = (RTCHitN)auVar174[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar174[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar174[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar174[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar174[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar174[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar174 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar174);
                  auVar112 = vpcmpeqd_avx2(auVar174._0_32_,auVar174._0_32_);
                  local_a50[3] = auVar112;
                  local_a50[2] = auVar112;
                  local_a50[1] = auVar112;
                  *local_a50 = auVar112;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar11->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar11->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar196;
                  auVar174 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar174);
                  local_b30.valid = (int *)local_700;
                  local_b30.geometryUserPtr = pGVar7->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_400;
                  local_b30.N = 0x10;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_b30);
                    auVar287 = ZEXT3264(local_b00);
                    auVar286 = ZEXT3264(local_ae0);
                    auVar285 = ZEXT3264(local_ac0);
                    auVar284 = ZEXT3264(local_aa0);
                    auVar174 = vmovdqa64_avx512f(local_700);
                  }
                  uVar30 = vptestmd_avx512f(auVar174,auVar174);
                  if ((short)uVar30 != 0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_b30);
                      auVar287 = ZEXT3264(local_b00);
                      auVar286 = ZEXT3264(local_ae0);
                      auVar285 = ZEXT3264(local_ac0);
                      auVar284 = ZEXT3264(local_aa0);
                      auVar174 = vmovdqa64_avx512f(local_700);
                    }
                    uVar85 = vptestmd_avx512f(auVar174,auVar174);
                    if ((short)uVar85 != 0) {
                      iVar3 = *(int *)(local_b30.hit + 4);
                      iVar4 = *(int *)(local_b30.hit + 8);
                      iVar1 = *(int *)(local_b30.hit + 0xc);
                      iVar57 = *(int *)(local_b30.hit + 0x10);
                      iVar58 = *(int *)(local_b30.hit + 0x14);
                      iVar59 = *(int *)(local_b30.hit + 0x18);
                      iVar60 = *(int *)(local_b30.hit + 0x1c);
                      iVar61 = *(int *)(local_b30.hit + 0x20);
                      iVar62 = *(int *)(local_b30.hit + 0x24);
                      iVar63 = *(int *)(local_b30.hit + 0x28);
                      iVar64 = *(int *)(local_b30.hit + 0x2c);
                      iVar65 = *(int *)(local_b30.hit + 0x30);
                      iVar66 = *(int *)(local_b30.hit + 0x34);
                      iVar67 = *(int *)(local_b30.hit + 0x38);
                      iVar68 = *(int *)(local_b30.hit + 0x3c);
                      bVar81 = (byte)uVar85;
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar73 = (byte)(uVar85 >> 8);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x300) =
                           (uint)(bVar81 & 1) * *(int *)local_b30.hit |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_b30.ray + 0x300);
                      *(uint *)(local_b30.ray + 0x304) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x304);
                      *(uint *)(local_b30.ray + 0x308) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x308);
                      *(uint *)(local_b30.ray + 0x30c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x30c);
                      *(uint *)(local_b30.ray + 0x310) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x310);
                      *(uint *)(local_b30.ray + 0x314) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x314);
                      *(uint *)(local_b30.ray + 0x318) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x318);
                      *(uint *)(local_b30.ray + 0x31c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x31c);
                      *(uint *)(local_b30.ray + 800) =
                           (uint)(bVar73 & 1) * iVar61 |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 800);
                      *(uint *)(local_b30.ray + 0x324) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x324);
                      *(uint *)(local_b30.ray + 0x328) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x328);
                      *(uint *)(local_b30.ray + 0x32c) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x32c);
                      *(uint *)(local_b30.ray + 0x330) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x330);
                      *(uint *)(local_b30.ray + 0x334) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x334);
                      *(uint *)(local_b30.ray + 0x338) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x338);
                      *(uint *)(local_b30.ray + 0x33c) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x33c);
                      iVar3 = *(int *)(local_b30.hit + 0x44);
                      iVar4 = *(int *)(local_b30.hit + 0x48);
                      iVar1 = *(int *)(local_b30.hit + 0x4c);
                      iVar57 = *(int *)(local_b30.hit + 0x50);
                      iVar58 = *(int *)(local_b30.hit + 0x54);
                      iVar59 = *(int *)(local_b30.hit + 0x58);
                      iVar60 = *(int *)(local_b30.hit + 0x5c);
                      iVar61 = *(int *)(local_b30.hit + 0x60);
                      iVar62 = *(int *)(local_b30.hit + 100);
                      iVar63 = *(int *)(local_b30.hit + 0x68);
                      iVar64 = *(int *)(local_b30.hit + 0x6c);
                      iVar65 = *(int *)(local_b30.hit + 0x70);
                      iVar66 = *(int *)(local_b30.hit + 0x74);
                      iVar67 = *(int *)(local_b30.hit + 0x78);
                      iVar68 = *(int *)(local_b30.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x340) =
                           (uint)(bVar81 & 1) * *(int *)(local_b30.hit + 0x40) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_b30.ray + 0x340);
                      *(uint *)(local_b30.ray + 0x344) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x344);
                      *(uint *)(local_b30.ray + 0x348) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x348);
                      *(uint *)(local_b30.ray + 0x34c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x34c);
                      *(uint *)(local_b30.ray + 0x350) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x350);
                      *(uint *)(local_b30.ray + 0x354) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x354);
                      *(uint *)(local_b30.ray + 0x358) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x358);
                      *(uint *)(local_b30.ray + 0x35c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x35c);
                      *(uint *)(local_b30.ray + 0x360) =
                           (uint)(bVar73 & 1) * iVar61 |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x360);
                      *(uint *)(local_b30.ray + 0x364) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x364);
                      *(uint *)(local_b30.ray + 0x368) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x368);
                      *(uint *)(local_b30.ray + 0x36c) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x36c);
                      *(uint *)(local_b30.ray + 0x370) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x370);
                      *(uint *)(local_b30.ray + 0x374) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x374);
                      *(uint *)(local_b30.ray + 0x378) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x378);
                      *(uint *)(local_b30.ray + 0x37c) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x37c);
                      iVar3 = *(int *)(local_b30.hit + 0x84);
                      iVar4 = *(int *)(local_b30.hit + 0x88);
                      iVar1 = *(int *)(local_b30.hit + 0x8c);
                      iVar57 = *(int *)(local_b30.hit + 0x90);
                      iVar58 = *(int *)(local_b30.hit + 0x94);
                      iVar59 = *(int *)(local_b30.hit + 0x98);
                      iVar60 = *(int *)(local_b30.hit + 0x9c);
                      iVar61 = *(int *)(local_b30.hit + 0xa0);
                      iVar62 = *(int *)(local_b30.hit + 0xa4);
                      iVar63 = *(int *)(local_b30.hit + 0xa8);
                      iVar64 = *(int *)(local_b30.hit + 0xac);
                      iVar65 = *(int *)(local_b30.hit + 0xb0);
                      iVar66 = *(int *)(local_b30.hit + 0xb4);
                      iVar67 = *(int *)(local_b30.hit + 0xb8);
                      iVar68 = *(int *)(local_b30.hit + 0xbc);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x380) =
                           (uint)(bVar81 & 1) * *(int *)(local_b30.hit + 0x80) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_b30.ray + 0x380);
                      *(uint *)(local_b30.ray + 900) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 900);
                      *(uint *)(local_b30.ray + 0x388) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x388);
                      *(uint *)(local_b30.ray + 0x38c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x38c);
                      *(uint *)(local_b30.ray + 0x390) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x390);
                      *(uint *)(local_b30.ray + 0x394) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x394);
                      *(uint *)(local_b30.ray + 0x398) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x398);
                      *(uint *)(local_b30.ray + 0x39c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x39c);
                      *(uint *)(local_b30.ray + 0x3a0) =
                           (uint)(bVar73 & 1) * iVar61 |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x3a0);
                      *(uint *)(local_b30.ray + 0x3a4) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3a4);
                      *(uint *)(local_b30.ray + 0x3a8) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3a8);
                      *(uint *)(local_b30.ray + 0x3ac) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ac);
                      *(uint *)(local_b30.ray + 0x3b0) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3b0);
                      *(uint *)(local_b30.ray + 0x3b4) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3b4);
                      *(uint *)(local_b30.ray + 0x3b8) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3b8);
                      *(uint *)(local_b30.ray + 0x3bc) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3bc);
                      iVar3 = *(int *)(local_b30.hit + 0xc4);
                      iVar4 = *(int *)(local_b30.hit + 200);
                      iVar1 = *(int *)(local_b30.hit + 0xcc);
                      iVar57 = *(int *)(local_b30.hit + 0xd0);
                      iVar58 = *(int *)(local_b30.hit + 0xd4);
                      iVar59 = *(int *)(local_b30.hit + 0xd8);
                      iVar60 = *(int *)(local_b30.hit + 0xdc);
                      iVar61 = *(int *)(local_b30.hit + 0xe0);
                      iVar62 = *(int *)(local_b30.hit + 0xe4);
                      iVar63 = *(int *)(local_b30.hit + 0xe8);
                      iVar64 = *(int *)(local_b30.hit + 0xec);
                      iVar65 = *(int *)(local_b30.hit + 0xf0);
                      iVar66 = *(int *)(local_b30.hit + 0xf4);
                      iVar67 = *(int *)(local_b30.hit + 0xf8);
                      iVar68 = *(int *)(local_b30.hit + 0xfc);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x3c0) =
                           (uint)(bVar81 & 1) * *(int *)(local_b30.hit + 0xc0) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_b30.ray + 0x3c0);
                      *(uint *)(local_b30.ray + 0x3c4) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x3c4);
                      *(uint *)(local_b30.ray + 0x3c8) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3c8);
                      *(uint *)(local_b30.ray + 0x3cc) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3cc);
                      *(uint *)(local_b30.ray + 0x3d0) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3d0);
                      *(uint *)(local_b30.ray + 0x3d4) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3d4);
                      *(uint *)(local_b30.ray + 0x3d8) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3d8);
                      *(uint *)(local_b30.ray + 0x3dc) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3dc);
                      *(uint *)(local_b30.ray + 0x3e0) =
                           (uint)(bVar73 & 1) * iVar61 |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x3e0);
                      *(uint *)(local_b30.ray + 0x3e4) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3e4);
                      *(uint *)(local_b30.ray + 1000) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 1000);
                      *(uint *)(local_b30.ray + 0x3ec) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ec);
                      *(uint *)(local_b30.ray + 0x3f0) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3f0);
                      *(uint *)(local_b30.ray + 0x3f4) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3f4);
                      *(uint *)(local_b30.ray + 0x3f8) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3f8);
                      *(uint *)(local_b30.ray + 0x3fc) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3fc);
                      iVar3 = *(int *)(local_b30.hit + 0x104);
                      iVar4 = *(int *)(local_b30.hit + 0x108);
                      iVar1 = *(int *)(local_b30.hit + 0x10c);
                      iVar57 = *(int *)(local_b30.hit + 0x110);
                      iVar58 = *(int *)(local_b30.hit + 0x114);
                      iVar59 = *(int *)(local_b30.hit + 0x118);
                      iVar60 = *(int *)(local_b30.hit + 0x11c);
                      iVar61 = *(int *)(local_b30.hit + 0x120);
                      iVar62 = *(int *)(local_b30.hit + 0x124);
                      iVar63 = *(int *)(local_b30.hit + 0x128);
                      iVar64 = *(int *)(local_b30.hit + 300);
                      iVar65 = *(int *)(local_b30.hit + 0x130);
                      iVar66 = *(int *)(local_b30.hit + 0x134);
                      iVar67 = *(int *)(local_b30.hit + 0x138);
                      iVar68 = *(int *)(local_b30.hit + 0x13c);
                      bVar13 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar85 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar85 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar85 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar85 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar85 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar85 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar85 >> 0xe) & 1);
                      bVar26 = SUB81(uVar85 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x400) =
                           (uint)(bVar81 & 1) * *(int *)(local_b30.hit + 0x100) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_b30.ray + 0x400);
                      *(uint *)(local_b30.ray + 0x404) =
                           (uint)bVar13 * iVar3 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x404);
                      *(uint *)(local_b30.ray + 0x408) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x408);
                      *(uint *)(local_b30.ray + 0x40c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x40c);
                      *(uint *)(local_b30.ray + 0x410) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x410);
                      *(uint *)(local_b30.ray + 0x414) =
                           (uint)bVar17 * iVar58 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x414);
                      *(uint *)(local_b30.ray + 0x418) =
                           (uint)bVar18 * iVar59 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x418);
                      *(uint *)(local_b30.ray + 0x41c) =
                           (uint)bVar19 * iVar60 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x41c);
                      *(uint *)(local_b30.ray + 0x420) =
                           (uint)(bVar73 & 1) * iVar61 |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_b30.ray + 0x420);
                      *(uint *)(local_b30.ray + 0x424) =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x424);
                      *(uint *)(local_b30.ray + 0x428) =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x428);
                      *(uint *)(local_b30.ray + 0x42c) =
                           (uint)bVar22 * iVar64 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x42c);
                      *(uint *)(local_b30.ray + 0x430) =
                           (uint)bVar23 * iVar65 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x430);
                      *(uint *)(local_b30.ray + 0x434) =
                           (uint)bVar24 * iVar66 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x434);
                      *(uint *)(local_b30.ray + 0x438) =
                           (uint)bVar25 * iVar67 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x438);
                      *(uint *)(local_b30.ray + 0x43c) =
                           (uint)bVar26 * iVar68 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x43c);
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                      auVar174 = vmovdqu32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar174;
                      auVar174 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                      auVar174 = vmovdqa32_avx512f(auVar174);
                      *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar174;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar198;
                  break;
                }
              }
              lVar82 = lVar82 + -1;
            } while (lVar82 != 0);
            uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar172._4_4_ = uVar177;
            auVar172._0_4_ = uVar177;
            auVar172._8_4_ = uVar177;
            auVar172._12_4_ = uVar177;
            auVar172._16_4_ = uVar177;
            auVar172._20_4_ = uVar177;
            auVar172._24_4_ = uVar177;
            auVar172._28_4_ = uVar177;
            auVar70._4_4_ = fStack_67c;
            auVar70._0_4_ = local_680;
            auVar70._8_4_ = fStack_678;
            auVar70._12_4_ = fStack_674;
            auVar70._16_4_ = fStack_670;
            auVar70._20_4_ = fStack_66c;
            auVar70._24_4_ = fStack_668;
            auVar70._28_4_ = fStack_664;
            uVar30 = vcmpps_avx512vl(auVar172,auVar70,0xd);
            bVar76 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar76 & (byte)uVar30;
          } while (bVar76 != 0);
          auVar148 = local_6a0;
          fVar175 = (float)local_9e0._0_4_;
          fVar196 = (float)local_9e0._4_4_;
          fVar198 = fStack_9d8;
          fVar200 = fStack_9d4;
          fVar159 = fStack_9d0;
          fVar202 = fStack_9cc;
          fVar204 = fStack_9c8;
          fVar206 = fStack_9c4;
        }
        auVar255 = ZEXT3264(local_a00);
        uVar31 = vpcmpgtd_avx512vl(auVar148,local_640);
        uVar32 = vpcmpd_avx512vl(local_640,local_5c0,1);
        auVar229._0_4_ = fVar175 + (float)local_540._0_4_;
        auVar229._4_4_ = fVar196 + (float)local_540._4_4_;
        auVar229._8_4_ = fVar198 + fStack_538;
        auVar229._12_4_ = fVar200 + fStack_534;
        auVar229._16_4_ = fVar159 + fStack_530;
        auVar229._20_4_ = fVar202 + fStack_52c;
        auVar229._24_4_ = fVar204 + fStack_528;
        auVar229._28_4_ = fVar206 + fStack_524;
        uVar30 = vcmpps_avx512vl(auVar229,auVar172,2);
        bVar77 = bVar77 & (byte)uVar32 & (byte)uVar30;
        auVar230._0_4_ = fVar175 + local_620._0_4_;
        auVar230._4_4_ = fVar196 + local_620._4_4_;
        auVar230._8_4_ = fVar198 + local_620._8_4_;
        auVar230._12_4_ = fVar200 + local_620._12_4_;
        auVar230._16_4_ = fVar159 + local_620._16_4_;
        auVar230._20_4_ = fVar202 + local_620._20_4_;
        auVar230._24_4_ = fVar204 + local_620._24_4_;
        auVar230._28_4_ = fVar206 + local_620._28_4_;
        uVar30 = vcmpps_avx512vl(auVar230,auVar172,2);
        bVar71 = bVar71 & (byte)uVar31 & (byte)uVar30 | bVar77;
        auVar272 = ZEXT3264(local_880);
        if (bVar71 != 0) {
          uVar74 = (ulong)uVar78;
          abStack_1a0[uVar74 * 0x60] = bVar71;
          auVar150._0_4_ =
               (uint)(bVar77 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar77 & 1) * (int)local_620._0_4_;
          bVar13 = (bool)(bVar77 >> 1 & 1);
          auVar150._4_4_ = (uint)bVar13 * local_540._4_4_ | (uint)!bVar13 * (int)local_620._4_4_;
          bVar13 = (bool)(bVar77 >> 2 & 1);
          auVar150._8_4_ = (uint)bVar13 * (int)fStack_538 | (uint)!bVar13 * (int)local_620._8_4_;
          bVar13 = (bool)(bVar77 >> 3 & 1);
          auVar150._12_4_ = (uint)bVar13 * (int)fStack_534 | (uint)!bVar13 * (int)local_620._12_4_;
          bVar13 = (bool)(bVar77 >> 4 & 1);
          auVar150._16_4_ = (uint)bVar13 * (int)fStack_530 | (uint)!bVar13 * (int)local_620._16_4_;
          bVar13 = (bool)(bVar77 >> 5 & 1);
          auVar150._20_4_ = (uint)bVar13 * (int)fStack_52c | (uint)!bVar13 * (int)local_620._20_4_;
          auVar150._24_4_ =
               (uint)(bVar77 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar77 >> 6) * (int)local_620._24_4_;
          auVar150._28_4_ = local_620._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar74 * 0x60) = auVar150;
          uVar85 = vmovlps_avx(local_650);
          (&uStack_160)[uVar74 * 0xc] = uVar85;
          aiStack_158[uVar74 * 0x18] = iVar79 + 1;
          uVar78 = uVar78 + 1;
        }
      }
    }
    do {
      uVar87 = uVar78;
      uVar86 = uVar87 - 1;
      if (uVar87 == 0) {
        uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar45._4_4_ = uVar177;
        auVar45._0_4_ = uVar177;
        auVar45._8_4_ = uVar177;
        auVar45._12_4_ = uVar177;
        uVar30 = vcmpps_avx512vl(local_660,auVar45,2);
        uVar75 = (uint)uVar30 & (uint)local_928 - 1 & (uint)local_928;
        local_928 = (ulong)uVar75;
        if (uVar75 == 0) {
          return;
        }
        goto LAB_01b71b10;
      }
      uVar85 = (ulong)uVar86;
      lVar82 = uVar85 * 0x60;
      auVar112 = *(undefined1 (*) [32])(auStack_180 + lVar82);
      auVar192._0_4_ = fVar175 + auVar112._0_4_;
      auVar192._4_4_ = fVar196 + auVar112._4_4_;
      auVar192._8_4_ = fVar198 + auVar112._8_4_;
      auVar192._12_4_ = fVar200 + auVar112._12_4_;
      auVar192._16_4_ = fVar159 + auVar112._16_4_;
      auVar192._20_4_ = fVar202 + auVar112._20_4_;
      auVar192._24_4_ = fVar204 + auVar112._24_4_;
      auVar192._28_4_ = fVar206 + auVar112._28_4_;
      uVar177 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar48._4_4_ = uVar177;
      auVar48._0_4_ = uVar177;
      auVar48._8_4_ = uVar177;
      auVar48._12_4_ = uVar177;
      auVar48._16_4_ = uVar177;
      auVar48._20_4_ = uVar177;
      auVar48._24_4_ = uVar177;
      auVar48._28_4_ = uVar177;
      uVar30 = vcmpps_avx512vl(auVar192,auVar48,2);
      uVar151 = (uint)uVar30 & (uint)abStack_1a0[lVar82];
      uVar78 = uVar86;
    } while (uVar151 == 0);
    uVar74 = (&uStack_160)[uVar85 * 0xc];
    auVar181._8_8_ = 0;
    auVar181._0_8_ = uVar74;
    auVar227._8_4_ = 0x7f800000;
    auVar227._0_8_ = 0x7f8000007f800000;
    auVar227._12_4_ = 0x7f800000;
    auVar227._16_4_ = 0x7f800000;
    auVar227._20_4_ = 0x7f800000;
    auVar227._24_4_ = 0x7f800000;
    auVar227._28_4_ = 0x7f800000;
    auVar114 = vblendmps_avx512vl(auVar227,auVar112);
    bVar71 = (byte)uVar151;
    auVar146._0_4_ =
         (uint)(bVar71 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)auVar112._0_4_;
    bVar13 = (bool)((byte)(uVar151 >> 1) & 1);
    auVar146._4_4_ = (uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * (int)auVar112._4_4_;
    bVar13 = (bool)((byte)(uVar151 >> 2) & 1);
    auVar146._8_4_ = (uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * (int)auVar112._8_4_;
    bVar13 = (bool)((byte)(uVar151 >> 3) & 1);
    auVar146._12_4_ = (uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * (int)auVar112._12_4_;
    bVar13 = (bool)((byte)(uVar151 >> 4) & 1);
    auVar146._16_4_ = (uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * (int)auVar112._16_4_;
    bVar13 = (bool)((byte)(uVar151 >> 5) & 1);
    auVar146._20_4_ = (uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * (int)auVar112._20_4_;
    bVar13 = (bool)((byte)(uVar151 >> 6) & 1);
    auVar146._24_4_ = (uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * (int)auVar112._24_4_;
    auVar146._28_4_ =
         (uVar151 >> 7) * auVar114._28_4_ | (uint)!SUB41(uVar151 >> 7,0) * (int)auVar112._28_4_;
    auVar112 = vshufps_avx(auVar146,auVar146,0xb1);
    auVar112 = vminps_avx(auVar146,auVar112);
    auVar114 = vshufpd_avx(auVar112,auVar112,5);
    auVar112 = vminps_avx(auVar112,auVar114);
    auVar114 = vpermpd_avx2(auVar112,0x4e);
    auVar112 = vminps_avx(auVar112,auVar114);
    uVar30 = vcmpps_avx512vl(auVar146,auVar112,0);
    bVar76 = (byte)uVar30 & bVar71;
    if (bVar76 != 0) {
      uVar151 = (uint)bVar76;
    }
    uVar152 = 0;
    for (; (uVar151 & 1) == 0; uVar151 = uVar151 >> 1 | 0x80000000) {
      uVar152 = uVar152 + 1;
    }
    iVar79 = aiStack_158[uVar85 * 0x18];
    bVar71 = ~('\x01' << ((byte)uVar152 & 0x1f)) & bVar71;
    abStack_1a0[lVar82] = bVar71;
    uVar78 = uVar87;
    if (bVar71 == 0) {
      uVar78 = uVar86;
    }
    uVar177 = (undefined4)uVar74;
    auVar169._4_4_ = uVar177;
    auVar169._0_4_ = uVar177;
    auVar169._8_4_ = uVar177;
    auVar169._12_4_ = uVar177;
    auVar169._16_4_ = uVar177;
    auVar169._20_4_ = uVar177;
    auVar169._24_4_ = uVar177;
    auVar169._28_4_ = uVar177;
    auVar94 = vmovshdup_avx(auVar181);
    auVar94 = vsubps_avx(auVar94,auVar181);
    auVar193._0_4_ = auVar94._0_4_;
    auVar193._4_4_ = auVar193._0_4_;
    auVar193._8_4_ = auVar193._0_4_;
    auVar193._12_4_ = auVar193._0_4_;
    auVar193._16_4_ = auVar193._0_4_;
    auVar193._20_4_ = auVar193._0_4_;
    auVar193._24_4_ = auVar193._0_4_;
    auVar193._28_4_ = auVar193._0_4_;
    auVar94 = vfmadd132ps_fma(auVar193,auVar169,_DAT_01faff20);
    auVar112 = ZEXT1632(auVar94);
    local_400[0] = (RTCHitN)auVar112[0];
    local_400[1] = (RTCHitN)auVar112[1];
    local_400[2] = (RTCHitN)auVar112[2];
    local_400[3] = (RTCHitN)auVar112[3];
    local_400[4] = (RTCHitN)auVar112[4];
    local_400[5] = (RTCHitN)auVar112[5];
    local_400[6] = (RTCHitN)auVar112[6];
    local_400[7] = (RTCHitN)auVar112[7];
    local_400[8] = (RTCHitN)auVar112[8];
    local_400[9] = (RTCHitN)auVar112[9];
    local_400[10] = (RTCHitN)auVar112[10];
    local_400[0xb] = (RTCHitN)auVar112[0xb];
    local_400[0xc] = (RTCHitN)auVar112[0xc];
    local_400[0xd] = (RTCHitN)auVar112[0xd];
    local_400[0xe] = (RTCHitN)auVar112[0xe];
    local_400[0xf] = (RTCHitN)auVar112[0xf];
    local_400[0x10] = (RTCHitN)auVar112[0x10];
    local_400[0x11] = (RTCHitN)auVar112[0x11];
    local_400[0x12] = (RTCHitN)auVar112[0x12];
    local_400[0x13] = (RTCHitN)auVar112[0x13];
    local_400[0x14] = (RTCHitN)auVar112[0x14];
    local_400[0x15] = (RTCHitN)auVar112[0x15];
    local_400[0x16] = (RTCHitN)auVar112[0x16];
    local_400[0x17] = (RTCHitN)auVar112[0x17];
    local_400[0x18] = (RTCHitN)auVar112[0x18];
    local_400[0x19] = (RTCHitN)auVar112[0x19];
    local_400[0x1a] = (RTCHitN)auVar112[0x1a];
    local_400[0x1b] = (RTCHitN)auVar112[0x1b];
    local_400[0x1c] = (RTCHitN)auVar112[0x1c];
    local_400[0x1d] = (RTCHitN)auVar112[0x1d];
    local_400[0x1e] = (RTCHitN)auVar112[0x1e];
    local_400[0x1f] = (RTCHitN)auVar112[0x1f];
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_400 + (ulong)uVar152 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }